

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [60];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  byte bVar50;
  uint uVar51;
  ulong uVar52;
  long lVar54;
  uint uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  float fVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [64];
  float t1;
  undefined4 uVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar141;
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vfloat4 b0;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vfloat4 b0_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  vfloat4 a0_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar226;
  float fVar227;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar239;
  float fVar240;
  vfloat4 a0_1;
  undefined1 auVar229 [16];
  float fVar241;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar242;
  float fVar248;
  float fVar249;
  vfloat4 a0;
  undefined1 auVar243 [16];
  float fVar250;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_640;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  uint auStack_5e0 [4];
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar53;
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar254 [32];
  
  PVar4 = prim[1];
  uVar58 = (ulong)(byte)PVar4;
  fVar142 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar65 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar67 = vsubps_avx(auVar64,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  fVar141 = fVar142 * auVar67._0_4_;
  fVar124 = fVar142 * auVar65._0_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar58 * 4 + 6);
  auVar95 = vpmovsxbd_avx2(auVar64);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar58 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar72);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar58 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar71);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar106 = vpmovsxbd_avx2(auVar70);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar73);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar107 = vcvtdq2ps_avx(auVar100);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar58 + 6);
  auVar94 = vpmovsxbd_avx2(auVar74);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar57 = (ulong)(uint)((int)(uVar58 * 9) * 2);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar57 + 6);
  auVar97 = vpmovsxbd_avx2(auVar69);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar57 + uVar58 + 6);
  auVar98 = vpmovsxbd_avx2(auVar68);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar52 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar52 + 6);
  auVar92 = vpmovsxbd_avx2(auVar3);
  auVar99 = vcvtdq2ps_avx(auVar92);
  auVar165._4_4_ = fVar124;
  auVar165._0_4_ = fVar124;
  auVar165._8_4_ = fVar124;
  auVar165._12_4_ = fVar124;
  auVar165._16_4_ = fVar124;
  auVar165._20_4_ = fVar124;
  auVar165._24_4_ = fVar124;
  auVar165._28_4_ = fVar124;
  auVar260._8_4_ = 1;
  auVar260._0_8_ = 0x100000001;
  auVar260._12_4_ = 1;
  auVar260._16_4_ = 1;
  auVar260._20_4_ = 1;
  auVar260._24_4_ = 1;
  auVar260._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = ZEXT1632(CONCAT412(fVar142 * auVar65._12_4_,
                                CONCAT48(fVar142 * auVar65._8_4_,
                                         CONCAT44(fVar142 * auVar65._4_4_,fVar124))));
  auVar101 = vpermps_avx2(auVar260,auVar102);
  auVar91 = vpermps_avx512vl(auVar90,auVar102);
  fVar124 = auVar91._0_4_;
  fVar217 = auVar91._4_4_;
  auVar102._4_4_ = fVar217 * auVar96._4_4_;
  auVar102._0_4_ = fVar124 * auVar96._0_4_;
  fVar226 = auVar91._8_4_;
  auVar102._8_4_ = fVar226 * auVar96._8_4_;
  fVar227 = auVar91._12_4_;
  auVar102._12_4_ = fVar227 * auVar96._12_4_;
  fVar130 = auVar91._16_4_;
  auVar102._16_4_ = fVar130 * auVar96._16_4_;
  fVar131 = auVar91._20_4_;
  auVar102._20_4_ = fVar131 * auVar96._20_4_;
  fVar132 = auVar91._24_4_;
  auVar102._24_4_ = fVar132 * auVar96._24_4_;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar94._4_4_ * fVar217;
  auVar100._0_4_ = auVar94._0_4_ * fVar124;
  auVar100._8_4_ = auVar94._8_4_ * fVar226;
  auVar100._12_4_ = auVar94._12_4_ * fVar227;
  auVar100._16_4_ = auVar94._16_4_ * fVar130;
  auVar100._20_4_ = auVar94._20_4_ * fVar131;
  auVar100._24_4_ = auVar94._24_4_ * fVar132;
  auVar100._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar99._4_4_ * fVar217;
  auVar92._0_4_ = auVar99._0_4_ * fVar124;
  auVar92._8_4_ = auVar99._8_4_ * fVar226;
  auVar92._12_4_ = auVar99._12_4_ * fVar227;
  auVar92._16_4_ = auVar99._16_4_ * fVar130;
  auVar92._20_4_ = auVar99._20_4_ * fVar131;
  auVar92._24_4_ = auVar99._24_4_ * fVar132;
  auVar92._28_4_ = auVar91._28_4_;
  auVar64 = vfmadd231ps_fma(auVar102,auVar101,auVar93);
  auVar72 = vfmadd231ps_fma(auVar100,auVar101,auVar107);
  auVar71 = vfmadd231ps_fma(auVar92,auVar98,auVar101);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar165,auVar95);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar165,auVar106);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar97,auVar165);
  auVar247._4_4_ = fVar141;
  auVar247._0_4_ = fVar141;
  auVar247._8_4_ = fVar141;
  auVar247._12_4_ = fVar141;
  auVar247._16_4_ = fVar141;
  auVar247._20_4_ = fVar141;
  auVar247._24_4_ = fVar141;
  auVar247._28_4_ = fVar141;
  auVar92 = ZEXT1632(CONCAT412(fVar142 * auVar67._12_4_,
                               CONCAT48(fVar142 * auVar67._8_4_,
                                        CONCAT44(fVar142 * auVar67._4_4_,fVar141))));
  auVar100 = vpermps_avx2(auVar260,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  fVar142 = auVar92._0_4_;
  fVar124 = auVar92._4_4_;
  auVar101._4_4_ = fVar124 * auVar96._4_4_;
  auVar101._0_4_ = fVar142 * auVar96._0_4_;
  fVar217 = auVar92._8_4_;
  auVar101._8_4_ = fVar217 * auVar96._8_4_;
  fVar226 = auVar92._12_4_;
  auVar101._12_4_ = fVar226 * auVar96._12_4_;
  fVar227 = auVar92._16_4_;
  auVar101._16_4_ = fVar227 * auVar96._16_4_;
  fVar130 = auVar92._20_4_;
  auVar101._20_4_ = fVar130 * auVar96._20_4_;
  fVar131 = auVar92._24_4_;
  auVar101._24_4_ = fVar131 * auVar96._24_4_;
  auVar101._28_4_ = 1;
  auVar90._4_4_ = auVar94._4_4_ * fVar124;
  auVar90._0_4_ = auVar94._0_4_ * fVar142;
  auVar90._8_4_ = auVar94._8_4_ * fVar217;
  auVar90._12_4_ = auVar94._12_4_ * fVar226;
  auVar90._16_4_ = auVar94._16_4_ * fVar227;
  auVar90._20_4_ = auVar94._20_4_ * fVar130;
  auVar90._24_4_ = auVar94._24_4_ * fVar131;
  auVar90._28_4_ = auVar96._28_4_;
  auVar94._4_4_ = auVar99._4_4_ * fVar124;
  auVar94._0_4_ = auVar99._0_4_ * fVar142;
  auVar94._8_4_ = auVar99._8_4_ * fVar217;
  auVar94._12_4_ = auVar99._12_4_ * fVar226;
  auVar94._16_4_ = auVar99._16_4_ * fVar227;
  auVar94._20_4_ = auVar99._20_4_ * fVar130;
  auVar94._24_4_ = auVar99._24_4_ * fVar131;
  auVar94._28_4_ = auVar92._28_4_;
  auVar70 = vfmadd231ps_fma(auVar101,auVar100,auVar93);
  auVar73 = vfmadd231ps_fma(auVar90,auVar100,auVar107);
  auVar74 = vfmadd231ps_fma(auVar94,auVar100,auVar98);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar247,auVar95);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar247,auVar106);
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar247,auVar97);
  auVar95 = vandps_avx(ZEXT1632(auVar64),auVar109);
  auVar154._8_4_ = 0x219392ef;
  auVar154._0_8_ = 0x219392ef219392ef;
  auVar154._12_4_ = 0x219392ef;
  auVar154._16_4_ = 0x219392ef;
  auVar154._20_4_ = 0x219392ef;
  auVar154._24_4_ = 0x219392ef;
  auVar154._28_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar95,auVar154,1);
  bVar62 = (bool)((byte)uVar57 & 1);
  auVar91._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._0_4_;
  bVar62 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._4_4_;
  bVar62 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._8_4_;
  bVar62 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar57 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar57 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar57 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar57 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar72),auVar109);
  uVar57 = vcmpps_avx512vl(auVar95,auVar154,1);
  bVar62 = (bool)((byte)uVar57 & 1);
  auVar103._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._0_4_;
  bVar62 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._4_4_;
  bVar62 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._8_4_;
  bVar62 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar57 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar57 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar57 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar57 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar71),auVar109);
  uVar57 = vcmpps_avx512vl(auVar95,auVar154,1);
  bVar62 = (bool)((byte)uVar57 & 1);
  auVar95._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar71._0_4_;
  bVar62 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar71._4_4_;
  bVar62 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar71._8_4_;
  bVar62 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar71._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar57 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar57 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar57 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar57 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar64 = vfnmadd213ps_fma(auVar91,auVar93,auVar110);
  auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar103);
  auVar72 = vfnmadd213ps_fma(auVar103,auVar93,auVar110);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar95);
  auVar71 = vfnmadd213ps_fma(auVar95,auVar93,auVar110);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar93,auVar93);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 7 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar70));
  auVar97._4_4_ = auVar64._4_4_ * auVar95._4_4_;
  auVar97._0_4_ = auVar64._0_4_ * auVar95._0_4_;
  auVar97._8_4_ = auVar64._8_4_ * auVar95._8_4_;
  auVar97._12_4_ = auVar64._12_4_ * auVar95._12_4_;
  auVar97._16_4_ = auVar95._16_4_ * 0.0;
  auVar97._20_4_ = auVar95._20_4_ * 0.0;
  auVar97._24_4_ = auVar95._24_4_ * 0.0;
  auVar97._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 9 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar70));
  auVar94 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar108._0_4_ = auVar64._0_4_ * auVar95._0_4_;
  auVar108._4_4_ = auVar64._4_4_ * auVar95._4_4_;
  auVar108._8_4_ = auVar64._8_4_ * auVar95._8_4_;
  auVar108._12_4_ = auVar64._12_4_ * auVar95._12_4_;
  auVar108._16_4_ = auVar95._16_4_ * 0.0;
  auVar108._20_4_ = auVar95._20_4_ * 0.0;
  auVar108._24_4_ = auVar95._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar58 * -2 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar73));
  auVar98._4_4_ = auVar72._4_4_ * auVar95._4_4_;
  auVar98._0_4_ = auVar72._0_4_ * auVar95._0_4_;
  auVar98._8_4_ = auVar72._8_4_ * auVar95._8_4_;
  auVar98._12_4_ = auVar72._12_4_ * auVar95._12_4_;
  auVar98._16_4_ = auVar95._16_4_ * 0.0;
  auVar98._20_4_ = auVar95._20_4_ * 0.0;
  auVar98._24_4_ = auVar95._24_4_ * 0.0;
  auVar98._28_4_ = auVar95._28_4_;
  auVar95 = vcvtdq2ps_avx(auVar93);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar73));
  auVar105._0_4_ = auVar72._0_4_ * auVar95._0_4_;
  auVar105._4_4_ = auVar72._4_4_ * auVar95._4_4_;
  auVar105._8_4_ = auVar72._8_4_ * auVar95._8_4_;
  auVar105._12_4_ = auVar72._12_4_ * auVar95._12_4_;
  auVar105._16_4_ = auVar95._16_4_ * 0.0;
  auVar105._20_4_ = auVar95._20_4_ * 0.0;
  auVar105._24_4_ = auVar95._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar52 + uVar58 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar74));
  auVar99._4_4_ = auVar95._4_4_ * auVar71._4_4_;
  auVar99._0_4_ = auVar95._0_4_ * auVar71._0_4_;
  auVar99._8_4_ = auVar95._8_4_ * auVar71._8_4_;
  auVar99._12_4_ = auVar95._12_4_ * auVar71._12_4_;
  auVar99._16_4_ = auVar95._16_4_ * 0.0;
  auVar99._20_4_ = auVar95._20_4_ * 0.0;
  auVar99._24_4_ = auVar95._24_4_ * 0.0;
  auVar99._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0x17 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar74));
  auVar104._0_4_ = auVar71._0_4_ * auVar95._0_4_;
  auVar104._4_4_ = auVar71._4_4_ * auVar95._4_4_;
  auVar104._8_4_ = auVar71._8_4_ * auVar95._8_4_;
  auVar104._12_4_ = auVar71._12_4_ * auVar95._12_4_;
  auVar104._16_4_ = auVar95._16_4_ * 0.0;
  auVar104._20_4_ = auVar95._20_4_ * 0.0;
  auVar104._24_4_ = auVar95._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar95 = vpminsd_avx2(auVar97,auVar108);
  auVar93 = vpminsd_avx2(auVar98,auVar105);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93 = vpminsd_avx2(auVar99,auVar104);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar96._4_4_ = uVar133;
  auVar96._0_4_ = uVar133;
  auVar96._8_4_ = uVar133;
  auVar96._12_4_ = uVar133;
  auVar96._16_4_ = uVar133;
  auVar96._20_4_ = uVar133;
  auVar96._24_4_ = uVar133;
  auVar96._28_4_ = uVar133;
  auVar93 = vmaxps_avx512vl(auVar93,auVar96);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar95,auVar93);
  auVar95 = vpmaxsd_avx2(auVar97,auVar108);
  auVar93 = vpmaxsd_avx2(auVar98,auVar105);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar93 = vpmaxsd_avx2(auVar99,auVar104);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar106._4_4_ = uVar133;
  auVar106._0_4_ = uVar133;
  auVar106._8_4_ = uVar133;
  auVar106._12_4_ = uVar133;
  auVar106._16_4_ = uVar133;
  auVar106._20_4_ = uVar133;
  auVar106._24_4_ = uVar133;
  auVar106._28_4_ = uVar133;
  auVar93 = vminps_avx512vl(auVar93,auVar106);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar107._8_4_ = 0x3f800003;
  auVar107._0_8_ = 0x3f8000033f800003;
  auVar107._12_4_ = 0x3f800003;
  auVar107._16_4_ = 0x3f800003;
  auVar107._20_4_ = 0x3f800003;
  auVar107._24_4_ = 0x3f800003;
  auVar107._28_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar107);
  uVar23 = vpcmpgtd_avx512vl(auVar94,_DAT_01fe9900);
  uVar22 = vcmpps_avx512vl(local_3c0,auVar95,2);
  if ((byte)((byte)uVar22 & (byte)uVar23) != 0) {
    uVar57 = (ulong)(byte)((byte)uVar22 & (byte)uVar23);
    auVar129 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_380 = vmovdqa64_avx512f(auVar129);
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar129 = ZEXT1664(auVar64);
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar261 = ZEXT1664(auVar64);
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar262 = ZEXT1664(auVar64);
    auVar269 = ZEXT464(0x3f800000);
    do {
      lVar54 = 0;
      for (uVar52 = uVar57; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
        lVar54 = lVar54 + 1;
      }
      uVar59 = *(uint *)(prim + 2);
      uVar5 = *(uint *)(prim + lVar54 * 4 + 6);
      pGVar7 = (context->scene->geometries).items[uVar59].ptr;
      uVar52 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                               pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar5);
      p_Var8 = pGVar7[1].intersectionFilterN;
      pvVar9 = pGVar7[2].userPtr;
      _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar64 = *(undefined1 (*) [16])(_Var10 + uVar52 * (long)pvVar9);
      auVar72 = *(undefined1 (*) [16])(_Var10 + (uVar52 + 1) * (long)pvVar9);
      auVar71 = *(undefined1 (*) [16])(_Var10 + (uVar52 + 2) * (long)pvVar9);
      auVar70 = *(undefined1 (*) [16])(_Var10 + (long)pvVar9 * (uVar52 + 3));
      lVar54 = *(long *)&pGVar7[1].time_range.upper;
      auVar73 = *(undefined1 (*) [16])(lVar54 + (long)p_Var8 * uVar52);
      auVar74 = *(undefined1 (*) [16])(lVar54 + (long)p_Var8 * (uVar52 + 1));
      auVar69 = *(undefined1 (*) [16])(lVar54 + (long)p_Var8 * (uVar52 + 2));
      uVar57 = uVar57 - 1 & uVar57;
      auVar68 = *(undefined1 (*) [16])(lVar54 + (long)p_Var8 * (uVar52 + 3));
      if (uVar57 != 0) {
        uVar58 = uVar57 - 1 & uVar57;
        for (uVar52 = uVar57; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
        }
        if (uVar58 != 0) {
          for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      fVar142 = *(float *)(ray + k * 4 + 0xc0);
      auVar134 = ZEXT816(0) << 0x40;
      auVar67._0_4_ = auVar68._0_4_ * 0.0;
      auVar67._4_4_ = auVar68._4_4_ * 0.0;
      auVar67._8_4_ = auVar68._8_4_ * 0.0;
      auVar67._12_4_ = auVar68._12_4_ * 0.0;
      auVar67 = vfmadd231ps_fma(auVar67,auVar69,auVar134);
      auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar74,auVar67);
      auVar76._0_4_ = auVar73._0_4_ + auVar65._0_4_;
      auVar76._4_4_ = auVar73._4_4_ + auVar65._4_4_;
      auVar76._8_4_ = auVar73._8_4_ + auVar65._8_4_;
      auVar76._12_4_ = auVar73._12_4_ + auVar65._12_4_;
      auVar78 = auVar129._0_16_;
      auVar65 = vfmadd231ps_avx512vl(auVar67,auVar74,auVar78);
      auVar66 = vfnmadd231ps_avx512vl(auVar65,auVar73,auVar78);
      auVar229._0_4_ = auVar70._0_4_ * 0.0;
      auVar229._4_4_ = auVar70._4_4_ * 0.0;
      auVar229._8_4_ = auVar70._8_4_ * 0.0;
      auVar229._12_4_ = auVar70._12_4_ * 0.0;
      auVar67 = vfmadd231ps_fma(auVar229,auVar71,auVar134);
      auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar72,auVar67);
      auVar243._0_4_ = auVar64._0_4_ + auVar65._0_4_;
      auVar243._4_4_ = auVar64._4_4_ + auVar65._4_4_;
      auVar243._8_4_ = auVar64._8_4_ + auVar65._8_4_;
      auVar243._12_4_ = auVar64._12_4_ + auVar65._12_4_;
      auVar65 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar78);
      auVar67 = vfnmadd231ps_avx512vl(auVar65,auVar64,auVar78);
      auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar69,auVar68);
      auVar65 = vfmadd231ps_fma(auVar65,auVar74,auVar134);
      auVar65 = vfmadd231ps_fma(auVar65,auVar73,auVar134);
      auVar68 = vmulps_avx512vl(auVar68,auVar78);
      auVar69 = vfnmadd231ps_avx512vl(auVar68,auVar78,auVar69);
      auVar74 = vfmadd231ps_fma(auVar69,auVar134,auVar74);
      auVar69 = vfnmadd231ps_fma(auVar74,auVar134,auVar73);
      auVar73 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar71,auVar70);
      auVar73 = vfmadd231ps_fma(auVar73,auVar72,auVar134);
      auVar73 = vfmadd231ps_fma(auVar73,auVar64,auVar134);
      auVar70 = vmulps_avx512vl(auVar70,auVar78);
      auVar71 = vfnmadd231ps_avx512vl(auVar70,auVar78,auVar71);
      auVar72 = vfmadd231ps_fma(auVar71,auVar134,auVar72);
      auVar74 = vfnmadd231ps_fma(auVar72,auVar134,auVar64);
      auVar64 = vshufps_avx(auVar66,auVar66,0xc9);
      auVar72 = vshufps_avx(auVar243,auVar243,0xc9);
      fVar130 = auVar66._0_4_;
      auVar168._0_4_ = fVar130 * auVar72._0_4_;
      fVar131 = auVar66._4_4_;
      auVar168._4_4_ = fVar131 * auVar72._4_4_;
      fVar132 = auVar66._8_4_;
      auVar168._8_4_ = fVar132 * auVar72._8_4_;
      fVar141 = auVar66._12_4_;
      auVar168._12_4_ = fVar141 * auVar72._12_4_;
      auVar72 = vfmsub231ps_fma(auVar168,auVar64,auVar243);
      auVar71 = vshufps_avx(auVar72,auVar72,0xc9);
      auVar72 = vshufps_avx(auVar67,auVar67,0xc9);
      auVar169._0_4_ = fVar130 * auVar72._0_4_;
      auVar169._4_4_ = fVar131 * auVar72._4_4_;
      auVar169._8_4_ = fVar132 * auVar72._8_4_;
      auVar169._12_4_ = fVar141 * auVar72._12_4_;
      auVar64 = vfmsub231ps_fma(auVar169,auVar64,auVar67);
      auVar70 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar64 = vshufps_avx(auVar69,auVar69,0xc9);
      auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
      fVar150 = auVar69._0_4_;
      auVar89._0_4_ = fVar150 * auVar72._0_4_;
      fVar156 = auVar69._4_4_;
      auVar89._4_4_ = fVar156 * auVar72._4_4_;
      fVar157 = auVar69._8_4_;
      auVar89._8_4_ = fVar157 * auVar72._8_4_;
      fVar158 = auVar69._12_4_;
      auVar89._12_4_ = fVar158 * auVar72._12_4_;
      auVar72 = vfmsub231ps_fma(auVar89,auVar64,auVar73);
      auVar73 = vshufps_avx(auVar72,auVar72,0xc9);
      auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
      auVar199._0_4_ = auVar72._0_4_ * fVar150;
      auVar199._4_4_ = auVar72._4_4_ * fVar156;
      auVar199._8_4_ = auVar72._8_4_ * fVar157;
      auVar199._12_4_ = auVar72._12_4_ * fVar158;
      auVar72 = vfmsub231ps_fma(auVar199,auVar64,auVar74);
      auVar64 = vdpps_avx(auVar71,auVar71,0x7f);
      auVar74 = vshufps_avx(auVar72,auVar72,0xc9);
      fVar124 = auVar64._0_4_;
      auVar200._4_12_ = ZEXT812(0) << 0x20;
      auVar200._0_4_ = fVar124;
      auVar72 = vrsqrt14ss_avx512f(auVar134,auVar200);
      auVar68 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
      auVar67 = vmulss_avx512f(auVar64,ZEXT416(0x3f000000));
      fVar217 = auVar72._0_4_;
      auVar72 = vdpps_avx(auVar71,auVar70,0x7f);
      fVar226 = auVar68._0_4_ - auVar67._0_4_ * fVar217 * fVar217 * fVar217;
      fVar228 = fVar226 * auVar71._0_4_;
      fVar239 = fVar226 * auVar71._4_4_;
      fVar240 = fVar226 * auVar71._8_4_;
      fVar241 = fVar226 * auVar71._12_4_;
      auVar210._0_4_ = auVar70._0_4_ * fVar124;
      auVar210._4_4_ = auVar70._4_4_ * fVar124;
      auVar210._8_4_ = auVar70._8_4_ * fVar124;
      auVar210._12_4_ = auVar70._12_4_ * fVar124;
      fVar124 = auVar72._0_4_;
      auVar179._0_4_ = fVar124 * auVar71._0_4_;
      auVar179._4_4_ = fVar124 * auVar71._4_4_;
      auVar179._8_4_ = fVar124 * auVar71._8_4_;
      auVar179._12_4_ = fVar124 * auVar71._12_4_;
      auVar71 = vsubps_avx(auVar210,auVar179);
      auVar72 = vrcp14ss_avx512f(auVar134,auVar200);
      auVar64 = vfnmadd213ss_avx512f(auVar64,auVar72,ZEXT416(0x40000000));
      fVar124 = auVar72._0_4_ * auVar64._0_4_;
      auVar64 = vdpps_avx(auVar73,auVar73,0x7f);
      fVar217 = auVar64._0_4_;
      auVar201._4_12_ = ZEXT812(0) << 0x20;
      auVar201._0_4_ = fVar217;
      auVar72 = vrsqrt14ss_avx512f(auVar134,auVar201);
      auVar70 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
      auVar68 = vmulss_avx512f(auVar64,ZEXT416(0x3f000000));
      fVar227 = auVar72._0_4_;
      fVar227 = auVar70._0_4_ - auVar68._0_4_ * fVar227 * fVar227 * fVar227;
      auVar72 = vdpps_avx(auVar73,auVar74,0x7f);
      fVar242 = fVar227 * auVar73._0_4_;
      fVar248 = fVar227 * auVar73._4_4_;
      fVar249 = fVar227 * auVar73._8_4_;
      fVar250 = fVar227 * auVar73._12_4_;
      auVar81._0_4_ = fVar217 * auVar74._0_4_;
      auVar81._4_4_ = fVar217 * auVar74._4_4_;
      auVar81._8_4_ = fVar217 * auVar74._8_4_;
      auVar81._12_4_ = fVar217 * auVar74._12_4_;
      fVar217 = auVar72._0_4_;
      auVar85._0_4_ = fVar217 * auVar73._0_4_;
      auVar85._4_4_ = fVar217 * auVar73._4_4_;
      auVar85._8_4_ = fVar217 * auVar73._8_4_;
      auVar85._12_4_ = fVar217 * auVar73._12_4_;
      auVar70 = vsubps_avx(auVar81,auVar85);
      auVar72 = vrcp14ss_avx512f(auVar134,auVar201);
      auVar64 = vfnmadd213ss_avx512f(auVar64,auVar72,ZEXT416(0x40000000));
      fVar217 = auVar64._0_4_ * auVar72._0_4_;
      auVar64 = vshufps_avx(auVar76,auVar76,0xff);
      auVar186._0_4_ = fVar228 * auVar64._0_4_;
      auVar186._4_4_ = fVar239 * auVar64._4_4_;
      auVar186._8_4_ = fVar240 * auVar64._8_4_;
      auVar186._12_4_ = fVar241 * auVar64._12_4_;
      local_520 = vsubps_avx(auVar76,auVar186);
      auVar72 = vshufps_avx(auVar66,auVar66,0xff);
      auVar82._0_4_ = auVar72._0_4_ * fVar228 + auVar64._0_4_ * fVar226 * fVar124 * auVar71._0_4_;
      auVar82._4_4_ = auVar72._4_4_ * fVar239 + auVar64._4_4_ * fVar226 * fVar124 * auVar71._4_4_;
      auVar82._8_4_ = auVar72._8_4_ * fVar240 + auVar64._8_4_ * fVar226 * fVar124 * auVar71._8_4_;
      auVar82._12_4_ =
           auVar72._12_4_ * fVar241 + auVar64._12_4_ * fVar226 * fVar124 * auVar71._12_4_;
      auVar71 = vsubps_avx(auVar66,auVar82);
      local_530._0_4_ = auVar186._0_4_ + auVar76._0_4_;
      local_530._4_4_ = auVar186._4_4_ + auVar76._4_4_;
      fStack_528 = auVar186._8_4_ + auVar76._8_4_;
      fStack_524 = auVar186._12_4_ + auVar76._12_4_;
      auVar64 = vshufps_avx(auVar65,auVar65,0xff);
      auVar88._0_4_ = fVar242 * auVar64._0_4_;
      auVar88._4_4_ = fVar248 * auVar64._4_4_;
      auVar88._8_4_ = fVar249 * auVar64._8_4_;
      auVar88._12_4_ = fVar250 * auVar64._12_4_;
      local_540 = vsubps_avx512vl(auVar65,auVar88);
      auVar72 = vshufps_avx(auVar69,auVar69,0xff);
      auVar77._0_4_ = auVar72._0_4_ * fVar242 + auVar64._0_4_ * fVar227 * auVar70._0_4_ * fVar217;
      auVar77._4_4_ = auVar72._4_4_ * fVar248 + auVar64._4_4_ * fVar227 * auVar70._4_4_ * fVar217;
      auVar77._8_4_ = auVar72._8_4_ * fVar249 + auVar64._8_4_ * fVar227 * auVar70._8_4_ * fVar217;
      auVar77._12_4_ =
           auVar72._12_4_ * fVar250 + auVar64._12_4_ * fVar227 * auVar70._12_4_ * fVar217;
      auVar64 = vsubps_avx(auVar69,auVar77);
      local_550._0_4_ = auVar65._0_4_ + auVar88._0_4_;
      local_550._4_4_ = auVar65._4_4_ + auVar88._4_4_;
      fStack_548 = auVar65._8_4_ + auVar88._8_4_;
      fStack_544 = auVar65._12_4_ + auVar88._12_4_;
      auVar86._0_4_ = auVar71._0_4_ * 0.33333334;
      auVar86._4_4_ = auVar71._4_4_ * 0.33333334;
      auVar86._8_4_ = auVar71._8_4_ * 0.33333334;
      auVar86._12_4_ = auVar71._12_4_ * 0.33333334;
      local_560 = vaddps_avx512vl(local_520,auVar86);
      auVar87._0_4_ = auVar64._0_4_ * 0.33333334;
      auVar87._4_4_ = auVar64._4_4_ * 0.33333334;
      auVar87._8_4_ = auVar64._8_4_ * 0.33333334;
      auVar87._12_4_ = auVar64._12_4_ * 0.33333334;
      local_570 = vsubps_avx512vl(local_540,auVar87);
      auVar66._0_4_ = (fVar130 + auVar82._0_4_) * 0.33333334;
      auVar66._4_4_ = (fVar131 + auVar82._4_4_) * 0.33333334;
      auVar66._8_4_ = (fVar132 + auVar82._8_4_) * 0.33333334;
      auVar66._12_4_ = (fVar141 + auVar82._12_4_) * 0.33333334;
      _local_580 = vaddps_avx512vl(_local_530,auVar66);
      auVar134._0_4_ = (fVar150 + auVar77._0_4_) * 0.33333334;
      auVar134._4_4_ = (fVar156 + auVar77._4_4_) * 0.33333334;
      auVar134._8_4_ = (fVar157 + auVar77._8_4_) * 0.33333334;
      auVar134._12_4_ = (fVar158 + auVar77._12_4_) * 0.33333334;
      _local_590 = vsubps_avx512vl(_local_550,auVar134);
      local_4a0 = vsubps_avx(local_520,auVar3);
      uVar133 = local_4a0._0_4_;
      auVar79._4_4_ = uVar133;
      auVar79._0_4_ = uVar133;
      auVar79._8_4_ = uVar133;
      auVar79._12_4_ = uVar133;
      auVar64 = vshufps_avx(local_4a0,local_4a0,0x55);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      auVar72 = vshufps_avx(local_4a0,local_4a0,0xaa);
      fVar124 = pre->ray_space[k].vz.field_0.m128[0];
      fVar217 = pre->ray_space[k].vz.field_0.m128[1];
      fVar226 = pre->ray_space[k].vz.field_0.m128[2];
      fVar227 = pre->ray_space[k].vz.field_0.m128[3];
      auVar75._0_4_ = fVar124 * auVar72._0_4_;
      auVar75._4_4_ = fVar217 * auVar72._4_4_;
      auVar75._8_4_ = fVar226 * auVar72._8_4_;
      auVar75._12_4_ = fVar227 * auVar72._12_4_;
      auVar64 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar2,auVar64);
      auVar74 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar79);
      local_4b0 = vsubps_avx512vl(local_560,auVar3);
      uVar133 = local_4b0._0_4_;
      auVar83._4_4_ = uVar133;
      auVar83._0_4_ = uVar133;
      auVar83._8_4_ = uVar133;
      auVar83._12_4_ = uVar133;
      auVar64 = vshufps_avx(local_4b0,local_4b0,0x55);
      auVar72 = vshufps_avx(local_4b0,local_4b0,0xaa);
      auVar80._0_4_ = fVar124 * auVar72._0_4_;
      auVar80._4_4_ = fVar217 * auVar72._4_4_;
      auVar80._8_4_ = fVar226 * auVar72._8_4_;
      auVar80._12_4_ = fVar227 * auVar72._12_4_;
      auVar64 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar2,auVar64);
      auVar69 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar83);
      local_4c0 = vsubps_avx512vl(local_570,auVar3);
      uVar133 = local_4c0._0_4_;
      auVar170._4_4_ = uVar133;
      auVar170._0_4_ = uVar133;
      auVar170._8_4_ = uVar133;
      auVar170._12_4_ = uVar133;
      auVar64 = vshufps_avx(local_4c0,local_4c0,0x55);
      auVar72 = vshufps_avx(local_4c0,local_4c0,0xaa);
      auVar84._0_4_ = fVar124 * auVar72._0_4_;
      auVar84._4_4_ = fVar217 * auVar72._4_4_;
      auVar84._8_4_ = fVar226 * auVar72._8_4_;
      auVar84._12_4_ = fVar227 * auVar72._12_4_;
      auVar64 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar2,auVar64);
      auVar68 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar170);
      local_4d0 = vsubps_avx512vl(local_540,auVar3);
      uVar133 = local_4d0._0_4_;
      auVar187._4_4_ = uVar133;
      auVar187._0_4_ = uVar133;
      auVar187._8_4_ = uVar133;
      auVar187._12_4_ = uVar133;
      auVar64 = vshufps_avx(local_4d0,local_4d0,0x55);
      auVar72 = vshufps_avx(local_4d0,local_4d0,0xaa);
      auVar171._0_4_ = fVar124 * auVar72._0_4_;
      auVar171._4_4_ = fVar217 * auVar72._4_4_;
      auVar171._8_4_ = fVar226 * auVar72._8_4_;
      auVar171._12_4_ = fVar227 * auVar72._12_4_;
      auVar64 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar2,auVar64);
      auVar65 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar187);
      local_4e0 = vsubps_avx(_local_530,auVar3);
      uVar133 = local_4e0._0_4_;
      auVar188._4_4_ = uVar133;
      auVar188._0_4_ = uVar133;
      auVar188._8_4_ = uVar133;
      auVar188._12_4_ = uVar133;
      auVar64 = vshufps_avx(local_4e0,local_4e0,0x55);
      auVar72 = vshufps_avx(local_4e0,local_4e0,0xaa);
      auVar211._0_4_ = auVar72._0_4_ * fVar124;
      auVar211._4_4_ = auVar72._4_4_ * fVar217;
      auVar211._8_4_ = auVar72._8_4_ * fVar226;
      auVar211._12_4_ = auVar72._12_4_ * fVar227;
      auVar64 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar2,auVar64);
      auVar67 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar188);
      local_4f0 = vsubps_avx512vl(_local_580,auVar3);
      uVar133 = local_4f0._0_4_;
      auVar189._4_4_ = uVar133;
      auVar189._0_4_ = uVar133;
      auVar189._8_4_ = uVar133;
      auVar189._12_4_ = uVar133;
      auVar64 = vshufps_avx(local_4f0,local_4f0,0x55);
      auVar72 = vshufps_avx(local_4f0,local_4f0,0xaa);
      auVar218._0_4_ = auVar72._0_4_ * fVar124;
      auVar218._4_4_ = auVar72._4_4_ * fVar217;
      auVar218._8_4_ = auVar72._8_4_ * fVar226;
      auVar218._12_4_ = auVar72._12_4_ * fVar227;
      auVar64 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar64);
      auVar66 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar189);
      local_500 = vsubps_avx512vl(_local_590,auVar3);
      uVar133 = local_500._0_4_;
      auVar190._4_4_ = uVar133;
      auVar190._0_4_ = uVar133;
      auVar190._8_4_ = uVar133;
      auVar190._12_4_ = uVar133;
      auVar64 = vshufps_avx(local_500,local_500,0x55);
      auVar72 = vshufps_avx(local_500,local_500,0xaa);
      auVar230._0_4_ = auVar72._0_4_ * fVar124;
      auVar230._4_4_ = auVar72._4_4_ * fVar217;
      auVar230._8_4_ = auVar72._8_4_ * fVar226;
      auVar230._12_4_ = auVar72._12_4_ * fVar227;
      auVar64 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar2,auVar64);
      auVar134 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar190);
      local_510 = vsubps_avx(_local_550,auVar3);
      uVar133 = local_510._0_4_;
      auVar78._4_4_ = uVar133;
      auVar78._0_4_ = uVar133;
      auVar78._8_4_ = uVar133;
      auVar78._12_4_ = uVar133;
      auVar64 = vshufps_avx(local_510,local_510,0x55);
      auVar72 = vshufps_avx(local_510,local_510,0xaa);
      auVar180._0_4_ = auVar72._0_4_ * fVar124;
      auVar180._4_4_ = auVar72._4_4_ * fVar217;
      auVar180._8_4_ = auVar72._8_4_ * fVar226;
      auVar180._12_4_ = auVar72._12_4_ * fVar227;
      auVar64 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar2,auVar64);
      auVar3 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar78);
      auVar71 = vmovlhps_avx(auVar74,auVar67);
      auVar70 = vmovlhps_avx(auVar69,auVar66);
      local_5f0 = vmovlhps_avx512f(auVar68,auVar134);
      _local_480 = vmovlhps_avx512f(auVar65,auVar3);
      auVar72 = vminps_avx(auVar71,auVar70);
      auVar64 = vmaxps_avx(auVar71,auVar70);
      auVar73 = vminps_avx512vl(local_5f0,_local_480);
      auVar72 = vminps_avx(auVar72,auVar73);
      auVar73 = vmaxps_avx512vl(local_5f0,_local_480);
      auVar64 = vmaxps_avx(auVar64,auVar73);
      auVar73 = vshufpd_avx(auVar72,auVar72,3);
      auVar72 = vminps_avx(auVar72,auVar73);
      auVar73 = vshufpd_avx(auVar64,auVar64,3);
      auVar64 = vmaxps_avx(auVar64,auVar73);
      auVar72 = vandps_avx512vl(auVar72,auVar261._0_16_);
      auVar64 = vandps_avx512vl(auVar64,auVar261._0_16_);
      auVar64 = vmaxps_avx(auVar72,auVar64);
      auVar72 = vmovshdup_avx(auVar64);
      auVar64 = vmaxss_avx(auVar72,auVar64);
      local_600 = vmovddup_avx512vl(auVar74);
      auVar267 = ZEXT1664(local_600);
      local_610 = vmovddup_avx512vl(auVar69);
      auVar268 = ZEXT1664(local_610);
      auVar73 = vmovddup_avx512vl(auVar68);
      auVar74 = vmovddup_avx512vl(auVar65);
      local_470 = ZEXT416((uint)(auVar64._0_4_ * 9.536743e-07));
      local_440 = vbroadcastss_avx512vl(local_470);
      auVar64 = vxorps_avx512vl(local_440._0_16_,auVar262._0_16_);
      local_460 = vbroadcastss_avx512vl(auVar64);
      uVar52 = 0;
      auVar64 = vsubps_avx(auVar70,auVar71);
      auVar69 = vsubps_avx512vl(local_5f0,auVar70);
      local_490 = vsubps_avx512vl(_local_480,local_5f0);
      local_5a0 = vsubps_avx(_local_530,local_520);
      local_5b0 = vsubps_avx512vl(_local_580,local_560);
      local_5c0 = vsubps_avx512vl(_local_590,local_570);
      _local_5d0 = vsubps_avx512vl(_local_550,local_540);
      auVar129 = vpbroadcastd_avx512f();
      local_300 = vmovdqa64_avx512f(auVar129);
      auVar129 = vpbroadcastd_avx512f();
      local_340 = vmovdqa64_avx512f(auVar129);
      auVar72 = ZEXT816(0x3f80000000000000);
      auVar122._32_32_ = auVar129._32_32_;
      auVar65 = auVar72;
LAB_01c9af37:
      auVar68 = vshufps_avx(auVar65,auVar65,0x50);
      auVar251._8_4_ = 0x3f800000;
      auVar251._0_8_ = 0x3f8000003f800000;
      auVar251._12_4_ = 0x3f800000;
      auVar254._16_4_ = 0x3f800000;
      auVar254._0_16_ = auVar251;
      auVar254._20_4_ = 0x3f800000;
      auVar254._24_4_ = 0x3f800000;
      auVar254._28_4_ = 0x3f800000;
      auVar78 = vsubps_avx(auVar251,auVar68);
      fVar124 = auVar68._0_4_;
      fVar130 = auVar67._0_4_;
      auVar151._0_4_ = fVar130 * fVar124;
      fVar217 = auVar68._4_4_;
      fVar131 = auVar67._4_4_;
      auVar151._4_4_ = fVar131 * fVar217;
      fVar226 = auVar68._8_4_;
      auVar151._8_4_ = fVar130 * fVar226;
      fVar227 = auVar68._12_4_;
      auVar151._12_4_ = fVar131 * fVar227;
      fVar132 = auVar66._0_4_;
      auVar159._0_4_ = fVar132 * fVar124;
      fVar141 = auVar66._4_4_;
      auVar159._4_4_ = fVar141 * fVar217;
      auVar159._8_4_ = fVar132 * fVar226;
      auVar159._12_4_ = fVar141 * fVar227;
      fVar150 = auVar134._0_4_;
      auVar172._0_4_ = fVar150 * fVar124;
      fVar156 = auVar134._4_4_;
      auVar172._4_4_ = fVar156 * fVar217;
      auVar172._8_4_ = fVar150 * fVar226;
      auVar172._12_4_ = fVar156 * fVar227;
      fVar157 = auVar3._0_4_;
      auVar136._0_4_ = fVar157 * fVar124;
      fVar158 = auVar3._4_4_;
      auVar136._4_4_ = fVar158 * fVar217;
      auVar136._8_4_ = fVar157 * fVar226;
      auVar136._12_4_ = fVar158 * fVar227;
      auVar75 = vfmadd231ps_avx512vl(auVar151,auVar78,auVar267._0_16_);
      auVar76 = vfmadd231ps_avx512vl(auVar159,auVar78,auVar268._0_16_);
      auVar77 = vfmadd231ps_avx512vl(auVar172,auVar78,auVar73);
      auVar78 = vfmadd231ps_avx512vl(auVar136,auVar74,auVar78);
      auVar68 = vmovshdup_avx(auVar72);
      fVar217 = auVar72._0_4_;
      fVar124 = (auVar68._0_4_ - fVar217) * 0.04761905;
      auVar198._4_4_ = fVar217;
      auVar198._0_4_ = fVar217;
      auVar198._8_4_ = fVar217;
      auVar198._12_4_ = fVar217;
      auVar198._16_4_ = fVar217;
      auVar198._20_4_ = fVar217;
      auVar198._24_4_ = fVar217;
      auVar198._28_4_ = fVar217;
      auVar148._0_8_ = auVar68._0_8_;
      auVar148._8_8_ = auVar148._0_8_;
      auVar148._16_8_ = auVar148._0_8_;
      auVar148._24_8_ = auVar148._0_8_;
      auVar95 = vsubps_avx(auVar148,auVar198);
      uVar133 = auVar75._0_4_;
      auVar149._4_4_ = uVar133;
      auVar149._0_4_ = uVar133;
      auVar149._8_4_ = uVar133;
      auVar149._12_4_ = uVar133;
      auVar149._16_4_ = uVar133;
      auVar149._20_4_ = uVar133;
      auVar149._24_4_ = uVar133;
      auVar149._28_4_ = uVar133;
      auVar214._8_4_ = 1;
      auVar214._0_8_ = 0x100000001;
      auVar214._12_4_ = 1;
      auVar214._16_4_ = 1;
      auVar214._20_4_ = 1;
      auVar214._24_4_ = 1;
      auVar214._28_4_ = 1;
      auVar106 = ZEXT1632(auVar75);
      auVar93 = vpermps_avx2(auVar214,auVar106);
      auVar96 = vbroadcastss_avx512vl(auVar76);
      auVar107 = ZEXT1632(auVar76);
      auVar94 = vpermps_avx512vl(auVar214,auVar107);
      auVar97 = vbroadcastss_avx512vl(auVar77);
      auVar104 = ZEXT1632(auVar77);
      auVar98 = vpermps_avx512vl(auVar214,auVar104);
      auVar99 = vbroadcastss_avx512vl(auVar78);
      auVar103 = ZEXT1632(auVar78);
      auVar100 = vpermps_avx512vl(auVar214,auVar103);
      auVar215._4_4_ = fVar124;
      auVar215._0_4_ = fVar124;
      auVar215._8_4_ = fVar124;
      auVar215._12_4_ = fVar124;
      auVar215._16_4_ = fVar124;
      auVar215._20_4_ = fVar124;
      auVar215._24_4_ = fVar124;
      auVar215._28_4_ = fVar124;
      auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar101 = vpermps_avx512vl(auVar92,auVar106);
      auVar185._8_4_ = 3;
      auVar185._0_8_ = 0x300000003;
      auVar185._12_4_ = 3;
      auVar185._16_4_ = 3;
      auVar185._20_4_ = 3;
      auVar185._24_4_ = 3;
      auVar185._28_4_ = 3;
      auVar102 = vpermps_avx512vl(auVar185,auVar106);
      auVar90 = vpermps_avx512vl(auVar92,auVar107);
      auVar106 = vpermps_avx2(auVar185,auVar107);
      auVar91 = vpermps_avx512vl(auVar92,auVar104);
      auVar107 = vpermps_avx2(auVar185,auVar104);
      auVar92 = vpermps_avx512vl(auVar92,auVar103);
      auVar103 = vpermps_avx512vl(auVar185,auVar103);
      auVar68 = vfmadd132ps_fma(auVar95,auVar198,_DAT_01faff20);
      auVar95 = vsubps_avx(auVar254,ZEXT1632(auVar68));
      auVar104 = vmulps_avx512vl(auVar96,ZEXT1632(auVar68));
      auVar108 = ZEXT1632(auVar68);
      auVar105 = vmulps_avx512vl(auVar94,auVar108);
      auVar78 = vfmadd231ps_fma(auVar104,auVar95,auVar149);
      auVar75 = vfmadd231ps_fma(auVar105,auVar95,auVar93);
      auVar104 = vmulps_avx512vl(auVar97,auVar108);
      auVar105 = vmulps_avx512vl(auVar98,auVar108);
      auVar96 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar96);
      auVar94 = vfmadd231ps_avx512vl(auVar105,auVar95,auVar94);
      auVar104 = vmulps_avx512vl(auVar99,auVar108);
      auVar105 = ZEXT1632(auVar68);
      auVar100 = vmulps_avx512vl(auVar100,auVar105);
      auVar97 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar97);
      auVar98 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar98);
      fVar226 = auVar68._0_4_;
      fVar227 = auVar68._4_4_;
      auVar28._4_4_ = fVar227 * auVar96._4_4_;
      auVar28._0_4_ = fVar226 * auVar96._0_4_;
      fVar228 = auVar68._8_4_;
      auVar28._8_4_ = fVar228 * auVar96._8_4_;
      fVar239 = auVar68._12_4_;
      auVar28._12_4_ = fVar239 * auVar96._12_4_;
      auVar28._16_4_ = auVar96._16_4_ * 0.0;
      auVar28._20_4_ = auVar96._20_4_ * 0.0;
      auVar28._24_4_ = auVar96._24_4_ * 0.0;
      auVar28._28_4_ = fVar217;
      auVar29._4_4_ = fVar227 * auVar94._4_4_;
      auVar29._0_4_ = fVar226 * auVar94._0_4_;
      auVar29._8_4_ = fVar228 * auVar94._8_4_;
      auVar29._12_4_ = fVar239 * auVar94._12_4_;
      auVar29._16_4_ = auVar94._16_4_ * 0.0;
      auVar29._20_4_ = auVar94._20_4_ * 0.0;
      auVar29._24_4_ = auVar94._24_4_ * 0.0;
      auVar29._28_4_ = auVar93._28_4_;
      auVar78 = vfmadd231ps_fma(auVar28,auVar95,ZEXT1632(auVar78));
      auVar75 = vfmadd231ps_fma(auVar29,auVar95,ZEXT1632(auVar75));
      auVar139._0_4_ = fVar226 * auVar97._0_4_;
      auVar139._4_4_ = fVar227 * auVar97._4_4_;
      auVar139._8_4_ = fVar228 * auVar97._8_4_;
      auVar139._12_4_ = fVar239 * auVar97._12_4_;
      auVar139._16_4_ = auVar97._16_4_ * 0.0;
      auVar139._20_4_ = auVar97._20_4_ * 0.0;
      auVar139._24_4_ = auVar97._24_4_ * 0.0;
      auVar139._28_4_ = 0;
      auVar30._4_4_ = fVar227 * auVar98._4_4_;
      auVar30._0_4_ = fVar226 * auVar98._0_4_;
      auVar30._8_4_ = fVar228 * auVar98._8_4_;
      auVar30._12_4_ = fVar239 * auVar98._12_4_;
      auVar30._16_4_ = auVar98._16_4_ * 0.0;
      auVar30._20_4_ = auVar98._20_4_ * 0.0;
      auVar30._24_4_ = auVar98._24_4_ * 0.0;
      auVar30._28_4_ = auVar97._28_4_;
      auVar76 = vfmadd231ps_fma(auVar139,auVar95,auVar96);
      auVar77 = vfmadd231ps_fma(auVar30,auVar95,auVar94);
      auVar31._28_4_ = auVar94._28_4_;
      auVar31._0_28_ =
           ZEXT1628(CONCAT412(fVar239 * auVar77._12_4_,
                              CONCAT48(fVar228 * auVar77._8_4_,
                                       CONCAT44(fVar227 * auVar77._4_4_,fVar226 * auVar77._0_4_))));
      auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar239 * auVar76._12_4_,
                                                   CONCAT48(fVar228 * auVar76._8_4_,
                                                            CONCAT44(fVar227 * auVar76._4_4_,
                                                                     fVar226 * auVar76._0_4_)))),
                                auVar95,ZEXT1632(auVar78));
      auVar80 = vfmadd231ps_fma(auVar31,auVar95,ZEXT1632(auVar75));
      auVar93 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar78));
      auVar96 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar75));
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar93 = vmulps_avx512vl(auVar93,auVar94);
      auVar96 = vmulps_avx512vl(auVar96,auVar94);
      auVar209._0_4_ = fVar124 * auVar93._0_4_;
      auVar209._4_4_ = fVar124 * auVar93._4_4_;
      auVar209._8_4_ = fVar124 * auVar93._8_4_;
      auVar209._12_4_ = fVar124 * auVar93._12_4_;
      auVar209._16_4_ = fVar124 * auVar93._16_4_;
      auVar209._20_4_ = fVar124 * auVar93._20_4_;
      auVar209._24_4_ = fVar124 * auVar93._24_4_;
      auVar209._28_4_ = 0;
      auVar93 = vmulps_avx512vl(auVar215,auVar96);
      auVar75 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
      auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_01feed00,ZEXT1632(auVar75));
      auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_01feed00,ZEXT1632(auVar75));
      auVar140._0_4_ = auVar209._0_4_ + auVar79._0_4_;
      auVar140._4_4_ = auVar209._4_4_ + auVar79._4_4_;
      auVar140._8_4_ = auVar209._8_4_ + auVar79._8_4_;
      auVar140._12_4_ = auVar209._12_4_ + auVar79._12_4_;
      auVar140._16_4_ = auVar209._16_4_ + 0.0;
      auVar140._20_4_ = auVar209._20_4_ + 0.0;
      auVar140._24_4_ = auVar209._24_4_ + 0.0;
      auVar140._28_4_ = 0;
      auVar108 = ZEXT1632(auVar75);
      auVar98 = vpermt2ps_avx512vl(auVar209,_DAT_01feed00,auVar108);
      auVar99 = vaddps_avx512vl(ZEXT1632(auVar80),auVar93);
      auVar100 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,auVar108);
      auVar93 = vsubps_avx(auVar96,auVar98);
      auVar98 = vsubps_avx512vl(auVar97,auVar100);
      auVar100 = vmulps_avx512vl(auVar90,auVar105);
      auVar104 = vmulps_avx512vl(auVar106,auVar105);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar101);
      auVar101 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar102);
      auVar102 = vmulps_avx512vl(auVar91,auVar105);
      auVar104 = vmulps_avx512vl(auVar107,auVar105);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar95,auVar90);
      auVar106 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar106);
      auVar92 = vmulps_avx512vl(auVar92,auVar105);
      auVar90 = vmulps_avx512vl(auVar103,auVar105);
      auVar78 = vfmadd231ps_fma(auVar92,auVar95,auVar91);
      auVar92 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar107);
      auVar90 = vmulps_avx512vl(auVar105,auVar102);
      auVar103 = ZEXT1632(auVar68);
      auVar91 = vmulps_avx512vl(auVar103,auVar106);
      auVar100 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar100);
      auVar101 = vfmadd231ps_avx512vl(auVar91,auVar95,auVar101);
      auVar92 = vmulps_avx512vl(auVar103,auVar92);
      auVar102 = vfmadd231ps_avx512vl
                           (ZEXT1632(CONCAT412(fVar239 * auVar78._12_4_,
                                               CONCAT48(fVar228 * auVar78._8_4_,
                                                        CONCAT44(fVar227 * auVar78._4_4_,
                                                                 fVar226 * auVar78._0_4_)))),auVar95
                            ,auVar102);
      auVar106 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar106);
      auVar32._4_4_ = fVar227 * auVar102._4_4_;
      auVar32._0_4_ = fVar226 * auVar102._0_4_;
      auVar32._8_4_ = fVar228 * auVar102._8_4_;
      auVar32._12_4_ = fVar239 * auVar102._12_4_;
      auVar32._16_4_ = auVar102._16_4_ * 0.0;
      auVar32._20_4_ = auVar102._20_4_ * 0.0;
      auVar32._24_4_ = auVar102._24_4_ * 0.0;
      auVar32._28_4_ = auVar107._28_4_;
      auVar107 = vmulps_avx512vl(auVar103,auVar106);
      auVar92 = vfmadd231ps_avx512vl(auVar32,auVar95,auVar100);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar101,auVar95);
      auVar95 = vsubps_avx512vl(auVar102,auVar100);
      auVar106 = vsubps_avx512vl(auVar106,auVar101);
      auVar95 = vmulps_avx512vl(auVar95,auVar94);
      auVar106 = vmulps_avx512vl(auVar106,auVar94);
      fVar217 = fVar124 * auVar95._0_4_;
      fVar226 = fVar124 * auVar95._4_4_;
      auVar33._4_4_ = fVar226;
      auVar33._0_4_ = fVar217;
      fVar227 = fVar124 * auVar95._8_4_;
      auVar33._8_4_ = fVar227;
      fVar228 = fVar124 * auVar95._12_4_;
      auVar33._12_4_ = fVar228;
      fVar239 = fVar124 * auVar95._16_4_;
      auVar33._16_4_ = fVar239;
      fVar240 = fVar124 * auVar95._20_4_;
      auVar33._20_4_ = fVar240;
      fVar124 = fVar124 * auVar95._24_4_;
      auVar33._24_4_ = fVar124;
      auVar33._28_4_ = auVar95._28_4_;
      auVar106 = vmulps_avx512vl(auVar215,auVar106);
      auVar94 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,auVar108);
      auVar100 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,auVar108);
      auVar216._0_4_ = auVar92._0_4_ + fVar217;
      auVar216._4_4_ = auVar92._4_4_ + fVar226;
      auVar216._8_4_ = auVar92._8_4_ + fVar227;
      auVar216._12_4_ = auVar92._12_4_ + fVar228;
      auVar216._16_4_ = auVar92._16_4_ + fVar239;
      auVar216._20_4_ = auVar92._20_4_ + fVar240;
      auVar216._24_4_ = auVar92._24_4_ + fVar124;
      auVar216._28_4_ = auVar92._28_4_ + auVar95._28_4_;
      auVar95 = vpermt2ps_avx512vl(auVar33,_DAT_01feed00,ZEXT1632(auVar75));
      auVar101 = vaddps_avx512vl(auVar107,auVar106);
      auVar106 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,ZEXT1632(auVar75));
      auVar95 = vsubps_avx(auVar94,auVar95);
      auVar106 = vsubps_avx512vl(auVar100,auVar106);
      auVar154 = ZEXT1632(auVar79);
      auVar102 = vsubps_avx512vl(auVar92,auVar154);
      auVar165 = ZEXT1632(auVar80);
      auVar90 = vsubps_avx512vl(auVar107,auVar165);
      auVar91 = vsubps_avx512vl(auVar94,auVar96);
      auVar102 = vaddps_avx512vl(auVar102,auVar91);
      auVar91 = vsubps_avx512vl(auVar100,auVar97);
      auVar90 = vaddps_avx512vl(auVar90,auVar91);
      auVar91 = vmulps_avx512vl(auVar165,auVar102);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar154,auVar90);
      auVar103 = vmulps_avx512vl(auVar99,auVar102);
      auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar140,auVar90);
      auVar104 = vmulps_avx512vl(auVar98,auVar102);
      auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar93,auVar90);
      auVar105 = vmulps_avx512vl(auVar97,auVar102);
      auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar96,auVar90);
      auVar108 = vmulps_avx512vl(auVar107,auVar102);
      auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar92,auVar90);
      auVar109 = vmulps_avx512vl(auVar101,auVar102);
      auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar216,auVar90);
      auVar110 = vmulps_avx512vl(auVar106,auVar102);
      auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar95,auVar90);
      auVar102 = vmulps_avx512vl(auVar100,auVar102);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar94,auVar90);
      auVar90 = vminps_avx512vl(auVar91,auVar103);
      auVar91 = vmaxps_avx512vl(auVar91,auVar103);
      auVar103 = vminps_avx512vl(auVar104,auVar105);
      auVar90 = vminps_avx512vl(auVar90,auVar103);
      auVar103 = vmaxps_avx512vl(auVar104,auVar105);
      auVar91 = vmaxps_avx512vl(auVar91,auVar103);
      auVar103 = vminps_avx512vl(auVar108,auVar109);
      auVar104 = vmaxps_avx512vl(auVar108,auVar109);
      auVar105 = vminps_avx512vl(auVar110,auVar102);
      auVar103 = vminps_avx512vl(auVar103,auVar105);
      auVar90 = vminps_avx512vl(auVar90,auVar103);
      auVar102 = vmaxps_avx512vl(auVar110,auVar102);
      auVar102 = vmaxps_avx512vl(auVar104,auVar102);
      auVar102 = vmaxps_avx512vl(auVar91,auVar102);
      uVar22 = vcmpps_avx512vl(auVar90,local_440,2);
      uVar23 = vcmpps_avx512vl(auVar102,local_460,5);
      bVar50 = (byte)uVar22 & (byte)uVar23 & 0x7f;
      if (bVar50 != 0) {
        auVar102 = vsubps_avx512vl(auVar96,auVar154);
        auVar90 = vsubps_avx512vl(auVar97,auVar165);
        auVar91 = vsubps_avx512vl(auVar94,auVar92);
        auVar102 = vaddps_avx512vl(auVar102,auVar91);
        auVar91 = vsubps_avx512vl(auVar100,auVar107);
        auVar90 = vaddps_avx512vl(auVar90,auVar91);
        auVar91 = vmulps_avx512vl(auVar165,auVar102);
        auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar90,auVar154);
        auVar99 = vmulps_avx512vl(auVar99,auVar102);
        auVar99 = vfnmadd213ps_avx512vl(auVar140,auVar90,auVar99);
        auVar98 = vmulps_avx512vl(auVar98,auVar102);
        auVar98 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar98);
        auVar93 = vmulps_avx512vl(auVar97,auVar102);
        auVar97 = vfnmadd231ps_avx512vl(auVar93,auVar90,auVar96);
        auVar93 = vmulps_avx512vl(auVar107,auVar102);
        auVar107 = vfnmadd231ps_avx512vl(auVar93,auVar90,auVar92);
        auVar93 = vmulps_avx512vl(auVar101,auVar102);
        auVar92 = vfnmadd213ps_avx512vl(auVar216,auVar90,auVar93);
        auVar93 = vmulps_avx512vl(auVar106,auVar102);
        auVar101 = vfnmadd213ps_avx512vl(auVar95,auVar90,auVar93);
        auVar95 = vmulps_avx512vl(auVar100,auVar102);
        auVar94 = vfnmadd231ps_avx512vl(auVar95,auVar94,auVar90);
        auVar93 = vminps_avx(auVar91,auVar99);
        auVar95 = vmaxps_avx(auVar91,auVar99);
        auVar96 = vminps_avx(auVar98,auVar97);
        auVar96 = vminps_avx(auVar93,auVar96);
        auVar93 = vmaxps_avx(auVar98,auVar97);
        auVar95 = vmaxps_avx(auVar95,auVar93);
        auVar106 = vminps_avx(auVar107,auVar92);
        auVar93 = vmaxps_avx(auVar107,auVar92);
        auVar107 = vminps_avx(auVar101,auVar94);
        auVar106 = vminps_avx(auVar106,auVar107);
        auVar106 = vminps_avx(auVar96,auVar106);
        auVar96 = vmaxps_avx(auVar101,auVar94);
        auVar93 = vmaxps_avx(auVar93,auVar96);
        auVar95 = vmaxps_avx(auVar95,auVar93);
        uVar22 = vcmpps_avx512vl(auVar95,local_460,5);
        uVar23 = vcmpps_avx512vl(auVar106,local_440,2);
        bVar50 = bVar50 & (byte)uVar22 & (byte)uVar23;
        if (bVar50 != 0) {
          auStack_5e0[uVar52] = (uint)bVar50;
          uVar22 = vmovlps_avx(auVar72);
          (&uStack_420)[uVar52] = uVar22;
          uVar58 = vmovlps_avx(auVar65);
          auStack_3a0[uVar52] = uVar58;
          uVar52 = (ulong)((int)uVar52 + 1);
        }
      }
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar129 = ZEXT1664(auVar72);
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar261 = ZEXT1664(auVar72);
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar262 = ZEXT1664(auVar72);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar263 = ZEXT3264(auVar95);
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar264 = ZEXT1664(auVar72);
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar265 = ZEXT1664(auVar72);
      auVar111._32_32_ = auVar122._32_32_;
      auVar111._0_32_ = _DAT_01feed20;
      auVar266 = ZEXT3264(_DAT_01feed20);
      auVar112._16_48_ = auVar111._16_48_;
      if ((int)uVar52 != 0) {
        do {
          auVar122._32_32_ = auVar112._32_32_;
          auVar78 = auVar268._0_16_;
          auVar68 = auVar267._0_16_;
          uVar51 = (int)uVar52 - 1;
          uVar53 = (ulong)uVar51;
          uVar6 = auStack_5e0[uVar53];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = auStack_3a0[uVar53];
          uVar58 = 0;
          for (uVar56 = (ulong)uVar6; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000)
          {
            uVar58 = uVar58 + 1;
          }
          uVar55 = uVar6 - 1 & uVar6;
          bVar62 = uVar55 == 0;
          auStack_5e0[uVar53] = uVar55;
          if (bVar62) {
            uVar52 = (ulong)uVar51;
          }
          auVar125._8_8_ = 0;
          auVar125._0_8_ = uVar58;
          auVar72 = vpunpcklqdq_avx(auVar125,ZEXT416((int)uVar58 + 1));
          auVar72 = vcvtqq2ps_avx512vl(auVar72);
          auVar72 = vmulps_avx512vl(auVar72,auVar264._0_16_);
          uVar133 = *(undefined4 *)((long)&uStack_420 + uVar53 * 8 + 4);
          auVar24._4_4_ = uVar133;
          auVar24._0_4_ = uVar133;
          auVar24._8_4_ = uVar133;
          auVar24._12_4_ = uVar133;
          auVar75 = vmulps_avx512vl(auVar72,auVar24);
          auVar76 = auVar265._0_16_;
          auVar72 = vsubps_avx512vl(auVar76,auVar72);
          uVar133 = *(undefined4 *)(&uStack_420 + uVar53);
          auVar25._4_4_ = uVar133;
          auVar25._0_4_ = uVar133;
          auVar25._8_4_ = uVar133;
          auVar25._12_4_ = uVar133;
          auVar72 = vfmadd231ps_avx512vl(auVar75,auVar72,auVar25);
          auVar75 = vmovshdup_avx(auVar72);
          fVar124 = auVar75._0_4_ - auVar72._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar124));
          if (uVar6 == 0 || bVar62) goto LAB_01c9af37;
          auVar75 = vshufps_avx(auVar65,auVar65,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar124));
          auVar77 = vsubps_avx512vl(auVar76,auVar75);
          fVar217 = auVar75._0_4_;
          auVar160._0_4_ = fVar217 * fVar130;
          fVar226 = auVar75._4_4_;
          auVar160._4_4_ = fVar226 * fVar131;
          fVar227 = auVar75._8_4_;
          auVar160._8_4_ = fVar227 * fVar130;
          fVar228 = auVar75._12_4_;
          auVar160._12_4_ = fVar228 * fVar131;
          auVar173._0_4_ = fVar217 * fVar132;
          auVar173._4_4_ = fVar226 * fVar141;
          auVar173._8_4_ = fVar227 * fVar132;
          auVar173._12_4_ = fVar228 * fVar141;
          auVar181._0_4_ = fVar217 * fVar150;
          auVar181._4_4_ = fVar226 * fVar156;
          auVar181._8_4_ = fVar227 * fVar150;
          auVar181._12_4_ = fVar228 * fVar156;
          auVar143._0_4_ = fVar217 * fVar157;
          auVar143._4_4_ = fVar226 * fVar158;
          auVar143._8_4_ = fVar227 * fVar157;
          auVar143._12_4_ = fVar228 * fVar158;
          auVar79 = vfmadd231ps_avx512vl(auVar160,auVar77,auVar68);
          auVar80 = vfmadd231ps_avx512vl(auVar173,auVar77,auVar78);
          auVar75 = vfmadd231ps_fma(auVar181,auVar77,auVar73);
          auVar77 = vfmadd231ps_fma(auVar143,auVar77,auVar74);
          auVar155._16_16_ = auVar79;
          auVar155._0_16_ = auVar79;
          auVar166._16_16_ = auVar80;
          auVar166._0_16_ = auVar80;
          auVar178._16_16_ = auVar75;
          auVar178._0_16_ = auVar75;
          auVar93 = vpermps_avx512vl(auVar266._0_32_,ZEXT1632(auVar72));
          auVar95 = vsubps_avx(auVar166,auVar155);
          auVar79 = vfmadd213ps_fma(auVar95,auVar93,auVar155);
          auVar95 = vsubps_avx(auVar178,auVar166);
          auVar80 = vfmadd213ps_fma(auVar95,auVar93,auVar166);
          auVar75 = vsubps_avx(auVar77,auVar75);
          auVar167._16_16_ = auVar75;
          auVar167._0_16_ = auVar75;
          auVar75 = vfmadd213ps_fma(auVar167,auVar93,auVar178);
          auVar95 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar79));
          auVar77 = vfmadd213ps_fma(auVar95,auVar93,ZEXT1632(auVar79));
          auVar95 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar80));
          auVar75 = vfmadd213ps_fma(auVar95,auVar93,ZEXT1632(auVar80));
          auVar95 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar77));
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar95,auVar93);
          auVar122._0_32_ = vmulps_avx512vl(auVar95,auVar263._0_32_);
          fVar217 = fVar124 * 0.33333334;
          auVar182._0_8_ =
               CONCAT44(auVar169._4_4_ + fVar217 * auVar122._4_4_,
                        auVar169._0_4_ + fVar217 * auVar122._0_4_);
          auVar182._8_4_ = auVar169._8_4_ + fVar217 * auVar122._8_4_;
          auVar182._12_4_ = auVar169._12_4_ + fVar217 * auVar122._12_4_;
          auVar161._0_4_ = fVar217 * auVar122._16_4_;
          auVar161._4_4_ = fVar217 * auVar122._20_4_;
          auVar161._8_4_ = fVar217 * auVar122._24_4_;
          auVar161._12_4_ = fVar217 * auVar122._28_4_;
          auVar89 = vsubps_avx((undefined1  [16])0x0,auVar161);
          auVar86 = vshufpd_avx(auVar169,auVar169,3);
          auVar87 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar75 = vsubps_avx(auVar86,auVar169);
          auVar77 = vsubps_avx(auVar87,(undefined1  [16])0x0);
          auVar202._0_4_ = auVar75._0_4_ + auVar77._0_4_;
          auVar202._4_4_ = auVar75._4_4_ + auVar77._4_4_;
          auVar202._8_4_ = auVar75._8_4_ + auVar77._8_4_;
          auVar202._12_4_ = auVar75._12_4_ + auVar77._12_4_;
          auVar75 = vshufps_avx(auVar169,auVar169,0xb1);
          auVar77 = vshufps_avx(auVar182,auVar182,0xb1);
          auVar79 = vshufps_avx(auVar89,auVar89,0xb1);
          auVar80 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar252._4_4_ = auVar202._0_4_;
          auVar252._0_4_ = auVar202._0_4_;
          auVar252._8_4_ = auVar202._0_4_;
          auVar252._12_4_ = auVar202._0_4_;
          auVar83 = vshufps_avx(auVar202,auVar202,0x55);
          fVar217 = auVar83._0_4_;
          auVar212._0_4_ = auVar75._0_4_ * fVar217;
          fVar226 = auVar83._4_4_;
          auVar212._4_4_ = auVar75._4_4_ * fVar226;
          fVar227 = auVar83._8_4_;
          auVar212._8_4_ = auVar75._8_4_ * fVar227;
          fVar228 = auVar83._12_4_;
          auVar212._12_4_ = auVar75._12_4_ * fVar228;
          auVar219._0_4_ = auVar77._0_4_ * fVar217;
          auVar219._4_4_ = auVar77._4_4_ * fVar226;
          auVar219._8_4_ = auVar77._8_4_ * fVar227;
          auVar219._12_4_ = auVar77._12_4_ * fVar228;
          auVar231._0_4_ = auVar79._0_4_ * fVar217;
          auVar231._4_4_ = auVar79._4_4_ * fVar226;
          auVar231._8_4_ = auVar79._8_4_ * fVar227;
          auVar231._12_4_ = auVar79._12_4_ * fVar228;
          auVar203._0_4_ = auVar80._0_4_ * fVar217;
          auVar203._4_4_ = auVar80._4_4_ * fVar226;
          auVar203._8_4_ = auVar80._8_4_ * fVar227;
          auVar203._12_4_ = auVar80._12_4_ * fVar228;
          auVar75 = vfmadd231ps_fma(auVar212,auVar252,auVar169);
          auVar77 = vfmadd231ps_fma(auVar219,auVar252,auVar182);
          auVar85 = vfmadd231ps_fma(auVar231,auVar252,auVar89);
          auVar168 = vfmadd231ps_fma(auVar203,(undefined1  [16])0x0,auVar252);
          auVar83 = vshufpd_avx(auVar75,auVar75,1);
          auVar84 = vshufpd_avx(auVar77,auVar77,1);
          auVar112._16_48_ = auVar122._16_48_;
          auVar81 = vshufpd_avx512vl(auVar85,auVar85,1);
          auVar82 = vshufpd_avx512vl(auVar168,auVar168,1);
          auVar79 = vminss_avx(auVar75,auVar77);
          auVar75 = vmaxss_avx(auVar77,auVar75);
          auVar80 = vminss_avx(auVar85,auVar168);
          auVar77 = vmaxss_avx(auVar168,auVar85);
          auVar79 = vminss_avx(auVar79,auVar80);
          auVar75 = vmaxss_avx(auVar77,auVar75);
          auVar80 = vminss_avx(auVar83,auVar84);
          auVar77 = vmaxss_avx(auVar84,auVar83);
          auVar83 = vminss_avx512f(auVar81,auVar82);
          auVar84 = vmaxss_avx512f(auVar82,auVar81);
          auVar77 = vmaxss_avx(auVar84,auVar77);
          auVar80 = vminss_avx512f(auVar80,auVar83);
          fVar226 = auVar77._0_4_;
          fVar217 = auVar75._0_4_;
          if (0.0001 <= auVar79._0_4_) {
LAB_01c9b672:
            vucomiss_avx512f(auVar80);
            bVar63 = fVar226 <= -0.0001;
            bVar61 = -0.0001 < fVar217;
            bVar60 = bVar63;
            if (!bVar63) goto LAB_01c9b6c8;
            uVar22 = vcmpps_avx512vl(auVar79,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar23 = vcmpps_avx512vl(auVar80,SUB6416(ZEXT464(0x38d1b717),0),5);
            bVar50 = (byte)uVar22 & (byte)uVar23 & 1;
            bVar63 = bVar61 && bVar50 == 0;
            bVar60 = bVar61 && bVar50 == 0;
            if (bVar61 && bVar50 == 0) goto LAB_01c9b6c8;
          }
          else {
            bVar63 = fVar226 == -0.0001;
            bVar60 = NAN(fVar226);
            if (fVar226 <= -0.0001) goto LAB_01c9b672;
LAB_01c9b6c8:
            auVar84 = vxorps_avx512vl(auVar78,auVar78);
            vcmpss_avx512f(auVar79,auVar84,1);
            uVar22 = vcmpss_avx512f(auVar75,auVar84,1);
            bVar61 = (bool)((byte)uVar22 & 1);
            auVar112._0_16_ = auVar269._0_16_;
            auVar267._4_60_ = auVar112._4_60_;
            auVar267._0_4_ = (float)((uint)bVar61 * -0x40800000 + (uint)!bVar61 * auVar269._0_4_);
            vucomiss_avx512f(auVar267._0_16_);
            bVar60 = (bool)(!bVar63 | bVar60);
            bVar61 = bVar60 == false;
            auVar113._16_48_ = auVar112._16_48_;
            auVar113._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar268._4_60_ = auVar113._4_60_;
            auVar268._0_4_ = (uint)bVar60 * auVar84._0_4_ + (uint)!bVar60 * 0x7f800000;
            auVar83 = auVar268._0_16_;
            auVar115._16_48_ = auVar112._16_48_;
            auVar115._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar114._4_60_ = auVar115._4_60_;
            auVar114._0_4_ = (uint)bVar60 * auVar84._0_4_ + (uint)!bVar60 * -0x800000;
            auVar78 = auVar114._0_16_;
            auVar68 = vxorps_avx512vl(auVar68,auVar68);
            uVar22 = vcmpss_avx512f(auVar80,auVar84,1);
            bVar63 = (bool)((byte)uVar22 & 1);
            auVar117._16_48_ = auVar112._16_48_;
            auVar117._0_16_ = auVar269._0_16_;
            auVar116._4_60_ = auVar117._4_60_;
            auVar116._0_4_ = (float)((uint)bVar63 * -0x40800000 + (uint)!bVar63 * auVar269._0_4_);
            vucomiss_avx512f(auVar116._0_16_);
            if ((bVar60) || (bVar61)) {
              auVar80 = vucomiss_avx512f(auVar79);
              if ((bVar60) || (bVar61)) {
                auVar84 = vxorps_avx512vl(auVar79,auVar262._0_16_);
                auVar79 = vsubss_avx512f(auVar80,auVar79);
                auVar79 = vdivss_avx512f(auVar84,auVar79);
                auVar80 = vsubss_avx512f(ZEXT416(0x3f800000),auVar79);
                auVar80 = vfmadd213ss_avx512f(auVar80,auVar68,auVar79);
                auVar79 = auVar80;
              }
              else {
                auVar80 = vxorps_avx512vl(auVar80,auVar80);
                vucomiss_avx512f(auVar80);
                if ((bVar60) || (auVar79 = ZEXT416(0x3f800000), bVar61)) {
                  auVar80 = ZEXT416(0x7f800000);
                  auVar79 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar83 = vminss_avx512f(auVar83,auVar80);
              auVar78 = vmaxss_avx(auVar79,auVar78);
            }
            auVar269 = ZEXT464(0x3f800000);
            uVar22 = vcmpss_avx512f(auVar77,auVar68,1);
            bVar63 = (bool)((byte)uVar22 & 1);
            auVar77 = auVar269._0_16_;
            fVar227 = (float)((uint)bVar63 * -0x40800000 + (uint)!bVar63 * 0x3f800000);
            if ((auVar267._0_4_ != fVar227) || (NAN(auVar267._0_4_) || NAN(fVar227))) {
              if ((fVar226 != fVar217) || (NAN(fVar226) || NAN(fVar217))) {
                auVar75 = vxorps_avx512vl(auVar75,auVar262._0_16_);
                auVar204._0_4_ = auVar75._0_4_ / (fVar226 - fVar217);
                auVar204._4_12_ = auVar75._4_12_;
                auVar75 = vsubss_avx512f(auVar77,auVar204);
                auVar75 = vfmadd213ss_avx512f(auVar75,auVar68,auVar204);
                auVar79 = auVar75;
              }
              else if ((fVar217 != 0.0) ||
                      (auVar75 = auVar77, auVar79 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar217))) {
                auVar75 = SUB6416(ZEXT464(0xff800000),0);
                auVar79 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar83 = vminss_avx(auVar83,auVar79);
              auVar78 = vmaxss_avx(auVar75,auVar78);
            }
            bVar63 = auVar116._0_4_ != fVar227;
            auVar75 = vminss_avx512f(auVar83,auVar77);
            auVar119._16_48_ = auVar112._16_48_;
            auVar119._0_16_ = auVar83;
            auVar118._4_60_ = auVar119._4_60_;
            auVar118._0_4_ = (uint)bVar63 * auVar75._0_4_ + (uint)!bVar63 * auVar83._0_4_;
            auVar75 = vmaxss_avx512f(auVar77,auVar78);
            auVar121._16_48_ = auVar112._16_48_;
            auVar121._0_16_ = auVar78;
            auVar120._4_60_ = auVar121._4_60_;
            auVar120._0_4_ = (uint)bVar63 * auVar75._0_4_ + (uint)!bVar63 * auVar78._0_4_;
            auVar78 = vmaxss_avx512f(auVar68,auVar118._0_16_);
            auVar75 = vminss_avx512f(auVar120._0_16_,auVar77);
            if (auVar78._0_4_ <= auVar75._0_4_) {
              auVar84 = vmaxss_avx512f(auVar68,ZEXT416((uint)(auVar78._0_4_ + -0.1)));
              auVar85 = vminss_avx512f(ZEXT416((uint)(auVar75._0_4_ + 0.1)),auVar77);
              auVar144._0_8_ = auVar169._0_8_;
              auVar144._8_8_ = auVar144._0_8_;
              auVar220._8_8_ = auVar182._0_8_;
              auVar220._0_8_ = auVar182._0_8_;
              auVar232._8_8_ = auVar89._0_8_;
              auVar232._0_8_ = auVar89._0_8_;
              auVar78 = vshufpd_avx(auVar182,auVar182,3);
              auVar75 = vshufpd_avx(auVar89,auVar89,3);
              auVar79 = vshufps_avx(auVar84,auVar85,0);
              auVar83 = vsubps_avx512vl(auVar76,auVar79);
              fVar217 = auVar79._0_4_;
              auVar174._0_4_ = fVar217 * auVar86._0_4_;
              fVar226 = auVar79._4_4_;
              auVar174._4_4_ = fVar226 * auVar86._4_4_;
              fVar227 = auVar79._8_4_;
              auVar174._8_4_ = fVar227 * auVar86._8_4_;
              fVar228 = auVar79._12_4_;
              auVar174._12_4_ = fVar228 * auVar86._12_4_;
              auVar183._0_4_ = fVar217 * auVar78._0_4_;
              auVar183._4_4_ = fVar226 * auVar78._4_4_;
              auVar183._8_4_ = fVar227 * auVar78._8_4_;
              auVar183._12_4_ = fVar228 * auVar78._12_4_;
              auVar255._0_4_ = auVar75._0_4_ * fVar217;
              auVar255._4_4_ = auVar75._4_4_ * fVar226;
              auVar255._8_4_ = auVar75._8_4_ * fVar227;
              auVar255._12_4_ = auVar75._12_4_ * fVar228;
              auVar162._0_4_ = fVar217 * auVar87._0_4_;
              auVar162._4_4_ = fVar226 * auVar87._4_4_;
              auVar162._8_4_ = fVar227 * auVar87._8_4_;
              auVar162._12_4_ = fVar228 * auVar87._12_4_;
              auVar80 = vfmadd231ps_fma(auVar174,auVar83,auVar144);
              auVar86 = vfmadd231ps_fma(auVar183,auVar83,auVar220);
              auVar87 = vfmadd231ps_fma(auVar255,auVar83,auVar232);
              auVar83 = vfmadd231ps_fma(auVar162,auVar83,ZEXT816(0));
              auVar75 = vsubss_avx512f(auVar77,auVar84);
              auVar78 = vmovshdup_avx(auVar65);
              auVar168 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar84._0_4_)),auVar65,
                                         auVar75);
              auVar75 = vsubss_avx512f(auVar77,auVar85);
              auVar169 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar85._0_4_)),auVar65,
                                         auVar75);
              auVar84 = vdivss_avx512f(auVar77,ZEXT416((uint)fVar124));
              auVar65 = vsubps_avx(auVar86,auVar80);
              auVar170 = auVar129._0_16_;
              auVar75 = vmulps_avx512vl(auVar65,auVar170);
              auVar65 = vsubps_avx(auVar87,auVar86);
              auVar79 = vmulps_avx512vl(auVar65,auVar170);
              auVar65 = vsubps_avx(auVar83,auVar87);
              auVar65 = vmulps_avx512vl(auVar65,auVar170);
              auVar78 = vminps_avx(auVar79,auVar65);
              auVar65 = vmaxps_avx(auVar79,auVar65);
              auVar78 = vminps_avx(auVar75,auVar78);
              auVar65 = vmaxps_avx(auVar75,auVar65);
              auVar75 = vshufpd_avx(auVar78,auVar78,3);
              auVar79 = vshufpd_avx(auVar65,auVar65,3);
              auVar78 = vminps_avx(auVar78,auVar75);
              auVar65 = vmaxps_avx(auVar65,auVar79);
              fVar124 = auVar84._0_4_;
              auVar205._0_4_ = auVar78._0_4_ * fVar124;
              auVar205._4_4_ = auVar78._4_4_ * fVar124;
              auVar205._8_4_ = auVar78._8_4_ * fVar124;
              auVar205._12_4_ = auVar78._12_4_ * fVar124;
              auVar191._0_4_ = fVar124 * auVar65._0_4_;
              auVar191._4_4_ = fVar124 * auVar65._4_4_;
              auVar191._8_4_ = fVar124 * auVar65._8_4_;
              auVar191._12_4_ = fVar124 * auVar65._12_4_;
              auVar84 = vdivss_avx512f(auVar77,ZEXT416((uint)(auVar169._0_4_ - auVar168._0_4_)));
              auVar65 = vshufpd_avx(auVar80,auVar80,3);
              auVar78 = vshufpd_avx(auVar86,auVar86,3);
              auVar75 = vshufpd_avx(auVar87,auVar87,3);
              auVar79 = vshufpd_avx(auVar83,auVar83,3);
              auVar65 = vsubps_avx(auVar65,auVar80);
              auVar80 = vsubps_avx(auVar78,auVar86);
              auVar86 = vsubps_avx(auVar75,auVar87);
              auVar79 = vsubps_avx(auVar79,auVar83);
              auVar78 = vminps_avx(auVar65,auVar80);
              auVar65 = vmaxps_avx(auVar65,auVar80);
              auVar75 = vminps_avx(auVar86,auVar79);
              auVar75 = vminps_avx(auVar78,auVar75);
              auVar78 = vmaxps_avx(auVar86,auVar79);
              auVar65 = vmaxps_avx(auVar65,auVar78);
              fVar124 = auVar84._0_4_;
              auVar233._0_4_ = fVar124 * auVar75._0_4_;
              auVar233._4_4_ = fVar124 * auVar75._4_4_;
              auVar233._8_4_ = fVar124 * auVar75._8_4_;
              auVar233._12_4_ = fVar124 * auVar75._12_4_;
              auVar221._0_4_ = fVar124 * auVar65._0_4_;
              auVar221._4_4_ = fVar124 * auVar65._4_4_;
              auVar221._8_4_ = fVar124 * auVar65._8_4_;
              auVar221._12_4_ = fVar124 * auVar65._12_4_;
              auVar79 = vinsertps_avx(auVar72,auVar168,0x10);
              auVar81 = vpermt2ps_avx512vl(auVar72,_DAT_01feecd0,auVar169);
              auVar135._0_4_ = auVar79._0_4_ + auVar81._0_4_;
              auVar135._4_4_ = auVar79._4_4_ + auVar81._4_4_;
              auVar135._8_4_ = auVar79._8_4_ + auVar81._8_4_;
              auVar135._12_4_ = auVar79._12_4_ + auVar81._12_4_;
              auVar26._8_4_ = 0x3f000000;
              auVar26._0_8_ = 0x3f0000003f000000;
              auVar26._12_4_ = 0x3f000000;
              auVar84 = vmulps_avx512vl(auVar135,auVar26);
              auVar78 = vshufps_avx(auVar84,auVar84,0x54);
              uVar133 = auVar84._0_4_;
              auVar137._4_4_ = uVar133;
              auVar137._0_4_ = uVar133;
              auVar137._8_4_ = uVar133;
              auVar137._12_4_ = uVar133;
              auVar80 = vfmadd213ps_avx512vl(auVar64,auVar137,auVar71);
              auVar86 = vfmadd213ps_avx512vl(auVar69,auVar137,auVar70);
              auVar75 = vfmadd213ps_fma(local_490,auVar137,local_5f0);
              auVar65 = vsubps_avx(auVar86,auVar80);
              auVar80 = vfmadd213ps_fma(auVar65,auVar137,auVar80);
              auVar65 = vsubps_avx(auVar75,auVar86);
              auVar65 = vfmadd213ps_fma(auVar65,auVar137,auVar86);
              auVar65 = vsubps_avx(auVar65,auVar80);
              auVar75 = vfmadd231ps_fma(auVar80,auVar65,auVar137);
              auVar87 = vmulps_avx512vl(auVar65,auVar170);
              auVar244._8_8_ = auVar75._0_8_;
              auVar244._0_8_ = auVar75._0_8_;
              auVar65 = vshufpd_avx(auVar75,auVar75,3);
              auVar75 = vshufps_avx(auVar84,auVar84,0x55);
              auVar80 = vsubps_avx(auVar65,auVar244);
              auVar86 = vfmadd231ps_fma(auVar244,auVar75,auVar80);
              auVar256._8_8_ = auVar87._0_8_;
              auVar256._0_8_ = auVar87._0_8_;
              auVar65 = vshufpd_avx(auVar87,auVar87,3);
              auVar65 = vsubps_avx512vl(auVar65,auVar256);
              auVar65 = vfmadd213ps_avx512vl(auVar65,auVar75,auVar256);
              auVar138._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
              auVar138._8_4_ = auVar80._8_4_ ^ 0x80000000;
              auVar138._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar75 = vmovshdup_avx512vl(auVar65);
              auVar257._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar257._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar257._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar87 = vmovshdup_avx512vl(auVar80);
              auVar83 = vpermt2ps_avx512vl(auVar257,ZEXT416(5),auVar80);
              auVar75 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar75._0_4_ * auVar80._0_4_)),auVar65,
                                            auVar87);
              auVar80 = vpermt2ps_avx512vl(auVar65,SUB6416(ZEXT464(4),0),auVar138);
              auVar163._0_4_ = auVar75._0_4_;
              auVar163._4_4_ = auVar163._0_4_;
              auVar163._8_4_ = auVar163._0_4_;
              auVar163._12_4_ = auVar163._0_4_;
              auVar65 = vdivps_avx(auVar83,auVar163);
              auVar82 = vdivps_avx512vl(auVar80,auVar163);
              fVar124 = auVar86._0_4_;
              auVar75 = vshufps_avx(auVar86,auVar86,0x55);
              auVar245._0_4_ = fVar124 * auVar65._0_4_ + auVar75._0_4_ * auVar82._0_4_;
              auVar245._4_4_ = fVar124 * auVar65._4_4_ + auVar75._4_4_ * auVar82._4_4_;
              auVar245._8_4_ = fVar124 * auVar65._8_4_ + auVar75._8_4_ * auVar82._8_4_;
              auVar245._12_4_ = fVar124 * auVar65._12_4_ + auVar75._12_4_ * auVar82._12_4_;
              auVar89 = vsubps_avx(auVar78,auVar245);
              auVar75 = vmovshdup_avx(auVar65);
              auVar78 = vinsertps_avx(auVar205,auVar233,0x1c);
              auVar258._0_4_ = auVar75._0_4_ * auVar78._0_4_;
              auVar258._4_4_ = auVar75._4_4_ * auVar78._4_4_;
              auVar258._8_4_ = auVar75._8_4_ * auVar78._8_4_;
              auVar258._12_4_ = auVar75._12_4_ * auVar78._12_4_;
              auVar85 = vinsertps_avx512f(auVar191,auVar221,0x1c);
              auVar75 = vmulps_avx512vl(auVar75,auVar85);
              auVar83 = vminps_avx512vl(auVar258,auVar75);
              auVar86 = vmaxps_avx(auVar75,auVar258);
              auVar87 = vmovshdup_avx(auVar82);
              auVar75 = vinsertps_avx(auVar233,auVar205,0x4c);
              auVar234._0_4_ = auVar87._0_4_ * auVar75._0_4_;
              auVar234._4_4_ = auVar87._4_4_ * auVar75._4_4_;
              auVar234._8_4_ = auVar87._8_4_ * auVar75._8_4_;
              auVar234._12_4_ = auVar87._12_4_ * auVar75._12_4_;
              auVar80 = vinsertps_avx(auVar221,auVar191,0x4c);
              auVar222._0_4_ = auVar87._0_4_ * auVar80._0_4_;
              auVar222._4_4_ = auVar87._4_4_ * auVar80._4_4_;
              auVar222._8_4_ = auVar87._8_4_ * auVar80._8_4_;
              auVar222._12_4_ = auVar87._12_4_ * auVar80._12_4_;
              auVar87 = vminps_avx(auVar234,auVar222);
              auVar83 = vaddps_avx512vl(auVar83,auVar87);
              auVar87 = vmaxps_avx(auVar222,auVar234);
              auVar223._0_4_ = auVar86._0_4_ + auVar87._0_4_;
              auVar223._4_4_ = auVar86._4_4_ + auVar87._4_4_;
              auVar223._8_4_ = auVar86._8_4_ + auVar87._8_4_;
              auVar223._12_4_ = auVar86._12_4_ + auVar87._12_4_;
              auVar235._8_8_ = 0x3f80000000000000;
              auVar235._0_8_ = 0x3f80000000000000;
              auVar86 = vsubps_avx(auVar235,auVar223);
              auVar87 = vsubps_avx(auVar235,auVar83);
              auVar83 = vsubps_avx(auVar79,auVar84);
              auVar84 = vsubps_avx(auVar81,auVar84);
              fVar228 = auVar83._0_4_;
              auVar259._0_4_ = fVar228 * auVar86._0_4_;
              fVar239 = auVar83._4_4_;
              auVar259._4_4_ = fVar239 * auVar86._4_4_;
              fVar240 = auVar83._8_4_;
              auVar259._8_4_ = fVar240 * auVar86._8_4_;
              fVar241 = auVar83._12_4_;
              auVar259._12_4_ = fVar241 * auVar86._12_4_;
              auVar88 = vbroadcastss_avx512vl(auVar65);
              auVar78 = vmulps_avx512vl(auVar88,auVar78);
              auVar85 = vmulps_avx512vl(auVar88,auVar85);
              auVar88 = vminps_avx512vl(auVar78,auVar85);
              auVar85 = vmaxps_avx512vl(auVar85,auVar78);
              auVar78 = vbroadcastss_avx512vl(auVar82);
              auVar75 = vmulps_avx512vl(auVar78,auVar75);
              auVar78 = vmulps_avx512vl(auVar78,auVar80);
              auVar80 = vminps_avx512vl(auVar75,auVar78);
              auVar80 = vaddps_avx512vl(auVar88,auVar80);
              auVar83 = vmulps_avx512vl(auVar83,auVar87);
              fVar124 = auVar84._0_4_;
              auVar224._0_4_ = fVar124 * auVar86._0_4_;
              fVar217 = auVar84._4_4_;
              auVar224._4_4_ = fVar217 * auVar86._4_4_;
              fVar226 = auVar84._8_4_;
              auVar224._8_4_ = fVar226 * auVar86._8_4_;
              fVar227 = auVar84._12_4_;
              auVar224._12_4_ = fVar227 * auVar86._12_4_;
              auVar236._0_4_ = fVar124 * auVar87._0_4_;
              auVar236._4_4_ = fVar217 * auVar87._4_4_;
              auVar236._8_4_ = fVar226 * auVar87._8_4_;
              auVar236._12_4_ = fVar227 * auVar87._12_4_;
              auVar78 = vmaxps_avx(auVar78,auVar75);
              auVar192._0_4_ = auVar85._0_4_ + auVar78._0_4_;
              auVar192._4_4_ = auVar85._4_4_ + auVar78._4_4_;
              auVar192._8_4_ = auVar85._8_4_ + auVar78._8_4_;
              auVar192._12_4_ = auVar85._12_4_ + auVar78._12_4_;
              auVar206._8_8_ = 0x3f800000;
              auVar206._0_8_ = 0x3f800000;
              auVar78 = vsubps_avx(auVar206,auVar192);
              auVar75 = vsubps_avx512vl(auVar206,auVar80);
              auVar253._0_4_ = fVar228 * auVar78._0_4_;
              auVar253._4_4_ = fVar239 * auVar78._4_4_;
              auVar253._8_4_ = fVar240 * auVar78._8_4_;
              auVar253._12_4_ = fVar241 * auVar78._12_4_;
              auVar246._0_4_ = fVar228 * auVar75._0_4_;
              auVar246._4_4_ = fVar239 * auVar75._4_4_;
              auVar246._8_4_ = fVar240 * auVar75._8_4_;
              auVar246._12_4_ = fVar241 * auVar75._12_4_;
              auVar193._0_4_ = fVar124 * auVar78._0_4_;
              auVar193._4_4_ = fVar217 * auVar78._4_4_;
              auVar193._8_4_ = fVar226 * auVar78._8_4_;
              auVar193._12_4_ = fVar227 * auVar78._12_4_;
              auVar207._0_4_ = fVar124 * auVar75._0_4_;
              auVar207._4_4_ = fVar217 * auVar75._4_4_;
              auVar207._8_4_ = fVar226 * auVar75._8_4_;
              auVar207._12_4_ = fVar227 * auVar75._12_4_;
              auVar78 = vminps_avx(auVar253,auVar246);
              auVar75 = vminps_avx512vl(auVar193,auVar207);
              auVar80 = vminps_avx512vl(auVar78,auVar75);
              auVar78 = vmaxps_avx(auVar246,auVar253);
              auVar75 = vmaxps_avx(auVar207,auVar193);
              auVar75 = vmaxps_avx(auVar75,auVar78);
              auVar86 = vminps_avx512vl(auVar259,auVar83);
              auVar78 = vminps_avx(auVar224,auVar236);
              auVar78 = vminps_avx(auVar86,auVar78);
              auVar78 = vhaddps_avx(auVar80,auVar78);
              auVar86 = vmaxps_avx512vl(auVar83,auVar259);
              auVar80 = vmaxps_avx(auVar236,auVar224);
              auVar80 = vmaxps_avx(auVar80,auVar86);
              auVar75 = vhaddps_avx(auVar75,auVar80);
              auVar78 = vshufps_avx(auVar78,auVar78,0xe8);
              auVar75 = vshufps_avx(auVar75,auVar75,0xe8);
              auVar194._0_4_ = auVar78._0_4_ + auVar89._0_4_;
              auVar194._4_4_ = auVar78._4_4_ + auVar89._4_4_;
              auVar194._8_4_ = auVar78._8_4_ + auVar89._8_4_;
              auVar194._12_4_ = auVar78._12_4_ + auVar89._12_4_;
              auVar208._0_4_ = auVar75._0_4_ + auVar89._0_4_;
              auVar208._4_4_ = auVar75._4_4_ + auVar89._4_4_;
              auVar208._8_4_ = auVar75._8_4_ + auVar89._8_4_;
              auVar208._12_4_ = auVar75._12_4_ + auVar89._12_4_;
              auVar78 = vmaxps_avx(auVar79,auVar194);
              auVar75 = vminps_avx(auVar208,auVar81);
              uVar58 = vcmpps_avx512vl(auVar75,auVar78,1);
              if ((uVar58 & 3) == 0) {
                uVar58 = vcmpps_avx512vl(auVar208,auVar81,1);
                uVar22 = vcmpps_avx512vl(auVar72,auVar194,1);
                if (((ushort)uVar22 & (ushort)uVar58 & 1) == 0) {
                  bVar50 = 0;
                }
                else {
                  auVar78 = vmovshdup_avx(auVar194);
                  bVar50 = auVar168._0_4_ < auVar78._0_4_ & (byte)(uVar58 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar52 || uVar6 != 0 && !bVar62) | bVar50) != 1) {
                  auVar65 = vinsertps_avx(auVar168,auVar169,0x10);
                  auVar267 = ZEXT1664(local_600);
                  auVar268 = ZEXT1664(local_610);
                  goto LAB_01c9af37;
                }
                lVar54 = 200;
                do {
                  auVar72 = vsubss_avx512f(auVar77,auVar89);
                  fVar226 = auVar72._0_4_;
                  fVar124 = fVar226 * fVar226 * fVar226;
                  auVar72 = vmulss_avx512f(auVar89,ZEXT416(0x40400000));
                  fVar217 = auVar72._0_4_ * fVar226 * fVar226;
                  fVar227 = auVar89._0_4_;
                  auVar75 = ZEXT416(0x40400000);
                  auVar72 = vmulss_avx512f(ZEXT416((uint)(fVar227 * fVar227)),auVar75);
                  fVar226 = fVar226 * auVar72._0_4_;
                  auVar152._4_4_ = fVar124;
                  auVar152._0_4_ = fVar124;
                  auVar152._8_4_ = fVar124;
                  auVar152._12_4_ = fVar124;
                  auVar145._4_4_ = fVar217;
                  auVar145._0_4_ = fVar217;
                  auVar145._8_4_ = fVar217;
                  auVar145._12_4_ = fVar217;
                  auVar126._4_4_ = fVar226;
                  auVar126._0_4_ = fVar226;
                  auVar126._8_4_ = fVar226;
                  auVar126._12_4_ = fVar226;
                  fVar227 = fVar227 * fVar227 * fVar227;
                  auVar175._0_4_ = (float)local_480._0_4_ * fVar227;
                  auVar175._4_4_ = (float)local_480._4_4_ * fVar227;
                  auVar175._8_4_ = fStack_478 * fVar227;
                  auVar175._12_4_ = fStack_474 * fVar227;
                  auVar72 = vfmadd231ps_fma(auVar175,local_5f0,auVar126);
                  auVar72 = vfmadd231ps_fma(auVar72,auVar70,auVar145);
                  auVar72 = vfmadd231ps_fma(auVar72,auVar71,auVar152);
                  auVar127._8_8_ = auVar72._0_8_;
                  auVar127._0_8_ = auVar72._0_8_;
                  auVar72 = vshufpd_avx(auVar72,auVar72,3);
                  auVar78 = vshufps_avx(auVar89,auVar89,0x55);
                  auVar72 = vsubps_avx(auVar72,auVar127);
                  auVar78 = vfmadd213ps_fma(auVar72,auVar78,auVar127);
                  fVar124 = auVar78._0_4_;
                  auVar72 = vshufps_avx(auVar78,auVar78,0x55);
                  auVar128._0_4_ = auVar65._0_4_ * fVar124 + auVar82._0_4_ * auVar72._0_4_;
                  auVar128._4_4_ = auVar65._4_4_ * fVar124 + auVar82._4_4_ * auVar72._4_4_;
                  auVar128._8_4_ = auVar65._8_4_ * fVar124 + auVar82._8_4_ * auVar72._8_4_;
                  auVar128._12_4_ = auVar65._12_4_ * fVar124 + auVar82._12_4_ * auVar72._12_4_;
                  auVar89 = vsubps_avx(auVar89,auVar128);
                  auVar72 = vandps_avx512vl(auVar78,auVar261._0_16_);
                  auVar78 = vprolq_avx512vl(auVar72,0x20);
                  auVar72 = vmaxss_avx(auVar78,auVar72);
                  bVar62 = (float)local_470._0_4_ < auVar72._0_4_;
                  if (auVar72._0_4_ < (float)local_470._0_4_) {
                    auVar72 = vucomiss_avx512f(auVar68);
                    if (bVar62) break;
                    auVar65 = vucomiss_avx512f(auVar72);
                    auVar269 = ZEXT1664(auVar65);
                    if (bVar62) break;
                    vmovshdup_avx(auVar72);
                    auVar68 = vucomiss_avx512f(auVar68);
                    if (bVar62) break;
                    auVar65 = vucomiss_avx512f(auVar68);
                    auVar269 = ZEXT1664(auVar65);
                    if (bVar62) break;
                    auVar78 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar84 = vinsertps_avx(auVar78,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar78 = vdpps_avx(auVar84,local_4a0,0x7f);
                    auVar77 = vdpps_avx(auVar84,local_4b0,0x7f);
                    auVar79 = vdpps_avx(auVar84,local_4c0,0x7f);
                    auVar80 = vdpps_avx(auVar84,local_4d0,0x7f);
                    auVar86 = vdpps_avx(auVar84,local_4e0,0x7f);
                    auVar87 = vdpps_avx(auVar84,local_4f0,0x7f);
                    auVar83 = vdpps_avx(auVar84,local_500,0x7f);
                    auVar84 = vdpps_avx(auVar84,local_510,0x7f);
                    auVar89 = vsubss_avx512f(auVar65,auVar68);
                    fVar228 = auVar68._0_4_;
                    auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar86._0_4_)),auVar89,
                                              auVar78);
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ * fVar228)),auVar89,
                                              auVar77);
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ * fVar228)),auVar89,
                                              auVar79);
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar84._0_4_)),auVar89,
                                              auVar80);
                    auVar65 = vsubss_avx512f(auVar65,auVar72);
                    auVar184._0_4_ = auVar65._0_4_;
                    fVar217 = auVar184._0_4_ * auVar184._0_4_ * auVar184._0_4_;
                    auVar65 = vmulss_avx512f(auVar72,auVar75);
                    fVar226 = auVar65._0_4_ * auVar184._0_4_ * auVar184._0_4_;
                    fVar124 = auVar72._0_4_;
                    auVar176._0_4_ = fVar124 * fVar124;
                    auVar176._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                    auVar176._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                    auVar176._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                    auVar65 = vmulss_avx512f(auVar176,auVar75);
                    fVar227 = auVar184._0_4_ * auVar65._0_4_;
                    fVar240 = fVar124 * auVar176._0_4_;
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * auVar79._0_4_)),
                                              ZEXT416((uint)fVar227),auVar77);
                    auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar226),auVar78);
                    auVar68 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar217),auVar68);
                    fVar239 = auVar68._0_4_;
                    if ((fVar239 < fVar142) ||
                       (fVar241 = *(float *)(ray + k * 4 + 0x200), fVar241 < fVar239)) break;
                    auVar68 = vshufps_avx(auVar72,auVar72,0x55);
                    auVar75 = vsubps_avx512vl(auVar76,auVar68);
                    fVar242 = auVar68._0_4_;
                    auVar213._0_4_ = fVar242 * (float)local_530._0_4_;
                    fVar248 = auVar68._4_4_;
                    auVar213._4_4_ = fVar248 * (float)local_530._4_4_;
                    fVar249 = auVar68._8_4_;
                    auVar213._8_4_ = fVar249 * fStack_528;
                    fVar250 = auVar68._12_4_;
                    auVar213._12_4_ = fVar250 * fStack_524;
                    auVar225._0_4_ = fVar242 * (float)local_580._0_4_;
                    auVar225._4_4_ = fVar248 * (float)local_580._4_4_;
                    auVar225._8_4_ = fVar249 * fStack_578;
                    auVar225._12_4_ = fVar250 * fStack_574;
                    auVar237._0_4_ = fVar242 * (float)local_590._0_4_;
                    auVar237._4_4_ = fVar248 * (float)local_590._4_4_;
                    auVar237._8_4_ = fVar249 * fStack_588;
                    auVar237._12_4_ = fVar250 * fStack_584;
                    auVar195._0_4_ = fVar242 * (float)local_550._0_4_;
                    auVar195._4_4_ = fVar248 * (float)local_550._4_4_;
                    auVar195._8_4_ = fVar249 * fStack_548;
                    auVar195._12_4_ = fVar250 * fStack_544;
                    auVar68 = vfmadd231ps_fma(auVar213,auVar75,local_520);
                    auVar65 = vfmadd231ps_fma(auVar225,auVar75,local_560);
                    auVar78 = vfmadd231ps_fma(auVar237,auVar75,local_570);
                    auVar75 = vfmadd231ps_fma(auVar195,auVar75,local_540);
                    auVar68 = vsubps_avx(auVar65,auVar68);
                    auVar65 = vsubps_avx(auVar78,auVar65);
                    auVar78 = vsubps_avx(auVar75,auVar78);
                    auVar238._0_4_ = fVar124 * auVar65._0_4_;
                    auVar238._4_4_ = fVar124 * auVar65._4_4_;
                    auVar238._8_4_ = fVar124 * auVar65._8_4_;
                    auVar238._12_4_ = fVar124 * auVar65._12_4_;
                    auVar184._4_4_ = auVar184._0_4_;
                    auVar184._8_4_ = auVar184._0_4_;
                    auVar184._12_4_ = auVar184._0_4_;
                    auVar68 = vfmadd231ps_fma(auVar238,auVar184,auVar68);
                    auVar196._0_4_ = fVar124 * auVar78._0_4_;
                    auVar196._4_4_ = fVar124 * auVar78._4_4_;
                    auVar196._8_4_ = fVar124 * auVar78._8_4_;
                    auVar196._12_4_ = fVar124 * auVar78._12_4_;
                    auVar65 = vfmadd231ps_fma(auVar196,auVar184,auVar65);
                    auVar197._0_4_ = fVar124 * auVar65._0_4_;
                    auVar197._4_4_ = fVar124 * auVar65._4_4_;
                    auVar197._8_4_ = fVar124 * auVar65._8_4_;
                    auVar197._12_4_ = fVar124 * auVar65._12_4_;
                    auVar68 = vfmadd231ps_fma(auVar197,auVar184,auVar68);
                    auVar68 = vmulps_avx512vl(auVar68,auVar170);
                    pGVar7 = (context->scene->geometries).items[uVar59].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                    auVar177._0_4_ = fVar240 * (float)local_5d0._0_4_;
                    auVar177._4_4_ = fVar240 * (float)local_5d0._4_4_;
                    auVar177._8_4_ = fVar240 * fStack_5c8;
                    auVar177._12_4_ = fVar240 * fStack_5c4;
                    auVar164._4_4_ = fVar227;
                    auVar164._0_4_ = fVar227;
                    auVar164._8_4_ = fVar227;
                    auVar164._12_4_ = fVar227;
                    auVar65 = vfmadd132ps_fma(auVar164,auVar177,local_5c0);
                    auVar153._4_4_ = fVar226;
                    auVar153._0_4_ = fVar226;
                    auVar153._8_4_ = fVar226;
                    auVar153._12_4_ = fVar226;
                    auVar65 = vfmadd132ps_fma(auVar153,auVar65,local_5b0);
                    auVar146._4_4_ = fVar217;
                    auVar146._0_4_ = fVar217;
                    auVar146._8_4_ = fVar217;
                    auVar146._12_4_ = fVar217;
                    auVar75 = vfmadd132ps_fma(auVar146,auVar65,local_5a0);
                    auVar65 = vshufps_avx(auVar75,auVar75,0xc9);
                    auVar78 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar147._0_4_ = auVar75._0_4_ * auVar78._0_4_;
                    auVar147._4_4_ = auVar75._4_4_ * auVar78._4_4_;
                    auVar147._8_4_ = auVar75._8_4_ * auVar78._8_4_;
                    auVar147._12_4_ = auVar75._12_4_ * auVar78._12_4_;
                    auVar68 = vfmsub231ps_fma(auVar147,auVar68,auVar65);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar239;
                      uVar133 = vextractps_avx(auVar68,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar133;
                      uVar133 = vextractps_avx(auVar68,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar133;
                      *(int *)(ray + k * 4 + 0x380) = auVar68._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar124;
                      *(float *)(ray + k * 4 + 0x400) = fVar228;
                      *(uint *)(ray + k * 4 + 0x440) = uVar5;
                      *(uint *)(ray + k * 4 + 0x480) = uVar59;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      break;
                    }
                    local_200 = vbroadcastss_avx512f(auVar72);
                    auVar122 = vbroadcastss_avx512f(ZEXT416(1));
                    local_1c0 = vpermps_avx512f(auVar122,ZEXT1664(auVar72));
                    auVar122 = vpermps_avx512f(auVar122,ZEXT1664(auVar68));
                    auVar267 = vbroadcastss_avx512f(ZEXT416(2));
                    local_280 = vpermps_avx512f(auVar267,ZEXT1664(auVar68));
                    local_240 = vbroadcastss_avx512f(auVar68);
                    local_2c0[0] = (RTCHitN)auVar122[0];
                    local_2c0[1] = (RTCHitN)auVar122[1];
                    local_2c0[2] = (RTCHitN)auVar122[2];
                    local_2c0[3] = (RTCHitN)auVar122[3];
                    local_2c0[4] = (RTCHitN)auVar122[4];
                    local_2c0[5] = (RTCHitN)auVar122[5];
                    local_2c0[6] = (RTCHitN)auVar122[6];
                    local_2c0[7] = (RTCHitN)auVar122[7];
                    local_2c0[8] = (RTCHitN)auVar122[8];
                    local_2c0[9] = (RTCHitN)auVar122[9];
                    local_2c0[10] = (RTCHitN)auVar122[10];
                    local_2c0[0xb] = (RTCHitN)auVar122[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar122[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar122[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar122[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar122[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar122[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar122[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar122[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar122[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar122[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar122[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar122[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar122[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar122[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar122[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar122[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar122[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar122[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar122[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar122[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar122[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar122[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar122[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar122[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar122[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar122[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar122[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar122[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar122[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar122[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar122[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar122[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar122[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar122[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar122[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar122[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar122[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar122[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar122[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar122[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar122[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar122[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar122[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar122[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar122[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar122[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar122[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar122[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar122[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar122[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar122[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar122[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar122[0x3f];
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar122 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar122);
                    vpcmpeqd_avx2(auVar122._0_32_,auVar122._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar239;
                    auVar122 = vmovdqa64_avx512f(local_380);
                    local_400 = vmovdqa64_avx512f(auVar122);
                    local_640.valid = (int *)local_400;
                    local_640.geometryUserPtr = pGVar7->userPtr;
                    local_640.context = context->user;
                    local_640.hit = local_2c0;
                    local_640.N = 0x10;
                    local_640.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_640);
                      auVar269 = ZEXT464(0x3f800000);
                      auVar266 = ZEXT3264(_DAT_01feed20);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar265 = ZEXT1664(auVar72);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar264 = ZEXT1664(auVar72);
                      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar263 = ZEXT3264(auVar95);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar262 = ZEXT1664(auVar72);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar261 = ZEXT1664(auVar72);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar129 = ZEXT1664(auVar72);
                      auVar122 = vmovdqa64_avx512f(local_400);
                    }
                    auVar112._16_48_ = auVar122._16_48_;
                    uVar22 = vptestmd_avx512f(auVar122,auVar122);
                    if ((short)uVar22 != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_640);
                        auVar269 = ZEXT464(0x3f800000);
                        auVar266 = ZEXT3264(_DAT_01feed20);
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar265 = ZEXT1664(auVar72);
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar264 = ZEXT1664(auVar72);
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar263 = ZEXT3264(auVar95);
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar262 = ZEXT1664(auVar72);
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar261 = ZEXT1664(auVar72);
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar129 = ZEXT1664(auVar72);
                        auVar122 = vmovdqa64_avx512f(local_400);
                        auVar112._16_48_ = auVar122._16_48_;
                      }
                      uVar58 = vptestmd_avx512f(auVar122,auVar122);
                      if ((short)uVar58 != 0) {
                        iVar35 = *(int *)(local_640.hit + 4);
                        iVar36 = *(int *)(local_640.hit + 8);
                        iVar37 = *(int *)(local_640.hit + 0xc);
                        iVar38 = *(int *)(local_640.hit + 0x10);
                        iVar39 = *(int *)(local_640.hit + 0x14);
                        iVar40 = *(int *)(local_640.hit + 0x18);
                        iVar41 = *(int *)(local_640.hit + 0x1c);
                        iVar42 = *(int *)(local_640.hit + 0x20);
                        iVar43 = *(int *)(local_640.hit + 0x24);
                        iVar44 = *(int *)(local_640.hit + 0x28);
                        iVar45 = *(int *)(local_640.hit + 0x2c);
                        iVar46 = *(int *)(local_640.hit + 0x30);
                        iVar47 = *(int *)(local_640.hit + 0x34);
                        iVar48 = *(int *)(local_640.hit + 0x38);
                        iVar49 = *(int *)(local_640.hit + 0x3c);
                        bVar50 = (byte)uVar58;
                        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar58 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar58 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar58 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar58 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar58 >> 7) & 1);
                        bVar14 = (byte)(uVar58 >> 8);
                        bVar15 = (bool)((byte)(uVar58 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar58 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar58 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar58 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar58 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar58 >> 0xe) & 1);
                        bVar21 = SUB81(uVar58 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x300) =
                             (uint)(bVar50 & 1) * *(int *)local_640.hit |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x300);
                        *(uint *)(local_640.ray + 0x304) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 0x304)
                        ;
                        *(uint *)(local_640.ray + 0x308) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x308)
                        ;
                        *(uint *)(local_640.ray + 0x30c) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x30c)
                        ;
                        *(uint *)(local_640.ray + 0x310) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x310)
                        ;
                        *(uint *)(local_640.ray + 0x314) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x314)
                        ;
                        *(uint *)(local_640.ray + 0x318) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x318)
                        ;
                        *(uint *)(local_640.ray + 0x31c) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x31c)
                        ;
                        *(uint *)(local_640.ray + 800) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 800);
                        *(uint *)(local_640.ray + 0x324) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x324)
                        ;
                        *(uint *)(local_640.ray + 0x328) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 0x328)
                        ;
                        *(uint *)(local_640.ray + 0x32c) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x32c)
                        ;
                        *(uint *)(local_640.ray + 0x330) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x330)
                        ;
                        *(uint *)(local_640.ray + 0x334) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x334)
                        ;
                        *(uint *)(local_640.ray + 0x338) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x338)
                        ;
                        *(uint *)(local_640.ray + 0x33c) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x33c)
                        ;
                        iVar35 = *(int *)(local_640.hit + 0x44);
                        iVar36 = *(int *)(local_640.hit + 0x48);
                        iVar37 = *(int *)(local_640.hit + 0x4c);
                        iVar38 = *(int *)(local_640.hit + 0x50);
                        iVar39 = *(int *)(local_640.hit + 0x54);
                        iVar40 = *(int *)(local_640.hit + 0x58);
                        iVar41 = *(int *)(local_640.hit + 0x5c);
                        iVar42 = *(int *)(local_640.hit + 0x60);
                        iVar43 = *(int *)(local_640.hit + 100);
                        iVar44 = *(int *)(local_640.hit + 0x68);
                        iVar45 = *(int *)(local_640.hit + 0x6c);
                        iVar46 = *(int *)(local_640.hit + 0x70);
                        iVar47 = *(int *)(local_640.hit + 0x74);
                        iVar48 = *(int *)(local_640.hit + 0x78);
                        iVar49 = *(int *)(local_640.hit + 0x7c);
                        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar58 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar58 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar58 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar58 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar58 >> 7) & 1);
                        bVar15 = (bool)((byte)(uVar58 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar58 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar58 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar58 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar58 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar58 >> 0xe) & 1);
                        bVar21 = SUB81(uVar58 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x340) =
                             (uint)(bVar50 & 1) * *(int *)(local_640.hit + 0x40) |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x340);
                        *(uint *)(local_640.ray + 0x344) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 0x344)
                        ;
                        *(uint *)(local_640.ray + 0x348) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x348)
                        ;
                        *(uint *)(local_640.ray + 0x34c) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x34c)
                        ;
                        *(uint *)(local_640.ray + 0x350) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x350)
                        ;
                        *(uint *)(local_640.ray + 0x354) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x354)
                        ;
                        *(uint *)(local_640.ray + 0x358) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x358)
                        ;
                        *(uint *)(local_640.ray + 0x35c) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x35c)
                        ;
                        *(uint *)(local_640.ray + 0x360) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 0x360);
                        *(uint *)(local_640.ray + 0x364) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x364)
                        ;
                        *(uint *)(local_640.ray + 0x368) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 0x368)
                        ;
                        *(uint *)(local_640.ray + 0x36c) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x36c)
                        ;
                        *(uint *)(local_640.ray + 0x370) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x370)
                        ;
                        *(uint *)(local_640.ray + 0x374) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x374)
                        ;
                        *(uint *)(local_640.ray + 0x378) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x378)
                        ;
                        *(uint *)(local_640.ray + 0x37c) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x37c)
                        ;
                        iVar35 = *(int *)(local_640.hit + 0x84);
                        iVar36 = *(int *)(local_640.hit + 0x88);
                        iVar37 = *(int *)(local_640.hit + 0x8c);
                        iVar38 = *(int *)(local_640.hit + 0x90);
                        iVar39 = *(int *)(local_640.hit + 0x94);
                        iVar40 = *(int *)(local_640.hit + 0x98);
                        iVar41 = *(int *)(local_640.hit + 0x9c);
                        iVar42 = *(int *)(local_640.hit + 0xa0);
                        iVar43 = *(int *)(local_640.hit + 0xa4);
                        iVar44 = *(int *)(local_640.hit + 0xa8);
                        iVar45 = *(int *)(local_640.hit + 0xac);
                        iVar46 = *(int *)(local_640.hit + 0xb0);
                        iVar47 = *(int *)(local_640.hit + 0xb4);
                        iVar48 = *(int *)(local_640.hit + 0xb8);
                        iVar49 = *(int *)(local_640.hit + 0xbc);
                        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar58 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar58 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar58 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar58 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar58 >> 7) & 1);
                        bVar15 = (bool)((byte)(uVar58 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar58 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar58 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar58 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar58 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar58 >> 0xe) & 1);
                        bVar21 = SUB81(uVar58 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x380) =
                             (uint)(bVar50 & 1) * *(int *)(local_640.hit + 0x80) |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x380);
                        *(uint *)(local_640.ray + 900) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 900);
                        *(uint *)(local_640.ray + 0x388) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x388)
                        ;
                        *(uint *)(local_640.ray + 0x38c) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x38c)
                        ;
                        *(uint *)(local_640.ray + 0x390) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x390)
                        ;
                        *(uint *)(local_640.ray + 0x394) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x394)
                        ;
                        *(uint *)(local_640.ray + 0x398) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x398)
                        ;
                        *(uint *)(local_640.ray + 0x39c) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x39c)
                        ;
                        *(uint *)(local_640.ray + 0x3a0) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 0x3a0);
                        *(uint *)(local_640.ray + 0x3a4) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x3a4)
                        ;
                        *(uint *)(local_640.ray + 0x3a8) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 0x3a8)
                        ;
                        *(uint *)(local_640.ray + 0x3ac) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x3ac)
                        ;
                        *(uint *)(local_640.ray + 0x3b0) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x3b0)
                        ;
                        *(uint *)(local_640.ray + 0x3b4) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x3b4)
                        ;
                        *(uint *)(local_640.ray + 0x3b8) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x3b8)
                        ;
                        *(uint *)(local_640.ray + 0x3bc) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x3bc)
                        ;
                        iVar35 = *(int *)(local_640.hit + 0xc4);
                        iVar36 = *(int *)(local_640.hit + 200);
                        iVar37 = *(int *)(local_640.hit + 0xcc);
                        iVar38 = *(int *)(local_640.hit + 0xd0);
                        iVar39 = *(int *)(local_640.hit + 0xd4);
                        iVar40 = *(int *)(local_640.hit + 0xd8);
                        iVar41 = *(int *)(local_640.hit + 0xdc);
                        iVar42 = *(int *)(local_640.hit + 0xe0);
                        iVar43 = *(int *)(local_640.hit + 0xe4);
                        iVar44 = *(int *)(local_640.hit + 0xe8);
                        iVar45 = *(int *)(local_640.hit + 0xec);
                        iVar46 = *(int *)(local_640.hit + 0xf0);
                        iVar47 = *(int *)(local_640.hit + 0xf4);
                        iVar48 = *(int *)(local_640.hit + 0xf8);
                        iVar49 = *(int *)(local_640.hit + 0xfc);
                        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar58 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar58 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar58 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar58 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar58 >> 7) & 1);
                        bVar15 = (bool)((byte)(uVar58 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar58 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar58 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar58 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar58 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar58 >> 0xe) & 1);
                        bVar21 = SUB81(uVar58 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x3c0) =
                             (uint)(bVar50 & 1) * *(int *)(local_640.hit + 0xc0) |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x3c0);
                        *(uint *)(local_640.ray + 0x3c4) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 0x3c4)
                        ;
                        *(uint *)(local_640.ray + 0x3c8) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x3c8)
                        ;
                        *(uint *)(local_640.ray + 0x3cc) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x3cc)
                        ;
                        *(uint *)(local_640.ray + 0x3d0) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x3d0)
                        ;
                        *(uint *)(local_640.ray + 0x3d4) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x3d4)
                        ;
                        *(uint *)(local_640.ray + 0x3d8) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x3d8)
                        ;
                        *(uint *)(local_640.ray + 0x3dc) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x3dc)
                        ;
                        *(uint *)(local_640.ray + 0x3e0) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 0x3e0);
                        *(uint *)(local_640.ray + 0x3e4) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x3e4)
                        ;
                        *(uint *)(local_640.ray + 1000) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 1000);
                        *(uint *)(local_640.ray + 0x3ec) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x3ec)
                        ;
                        *(uint *)(local_640.ray + 0x3f0) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x3f0)
                        ;
                        *(uint *)(local_640.ray + 0x3f4) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x3f4)
                        ;
                        *(uint *)(local_640.ray + 0x3f8) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x3f8)
                        ;
                        *(uint *)(local_640.ray + 0x3fc) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x3fc)
                        ;
                        iVar35 = *(int *)(local_640.hit + 0x104);
                        iVar36 = *(int *)(local_640.hit + 0x108);
                        iVar37 = *(int *)(local_640.hit + 0x10c);
                        iVar38 = *(int *)(local_640.hit + 0x110);
                        iVar39 = *(int *)(local_640.hit + 0x114);
                        iVar40 = *(int *)(local_640.hit + 0x118);
                        iVar41 = *(int *)(local_640.hit + 0x11c);
                        iVar42 = *(int *)(local_640.hit + 0x120);
                        iVar43 = *(int *)(local_640.hit + 0x124);
                        iVar44 = *(int *)(local_640.hit + 0x128);
                        iVar45 = *(int *)(local_640.hit + 300);
                        iVar46 = *(int *)(local_640.hit + 0x130);
                        iVar47 = *(int *)(local_640.hit + 0x134);
                        iVar48 = *(int *)(local_640.hit + 0x138);
                        iVar49 = *(int *)(local_640.hit + 0x13c);
                        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar58 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar58 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar58 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar58 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar58 >> 7) & 1);
                        bVar15 = (bool)((byte)(uVar58 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar58 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar58 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar58 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar58 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar58 >> 0xe) & 1);
                        bVar21 = SUB81(uVar58 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x400) =
                             (uint)(bVar50 & 1) * *(int *)(local_640.hit + 0x100) |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x400);
                        *(uint *)(local_640.ray + 0x404) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 0x404)
                        ;
                        *(uint *)(local_640.ray + 0x408) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x408)
                        ;
                        *(uint *)(local_640.ray + 0x40c) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x40c)
                        ;
                        *(uint *)(local_640.ray + 0x410) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x410)
                        ;
                        *(uint *)(local_640.ray + 0x414) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x414)
                        ;
                        *(uint *)(local_640.ray + 0x418) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x418)
                        ;
                        *(uint *)(local_640.ray + 0x41c) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x41c)
                        ;
                        *(uint *)(local_640.ray + 0x420) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 0x420);
                        *(uint *)(local_640.ray + 0x424) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x424)
                        ;
                        *(uint *)(local_640.ray + 0x428) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 0x428)
                        ;
                        *(uint *)(local_640.ray + 0x42c) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x42c)
                        ;
                        *(uint *)(local_640.ray + 0x430) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x430)
                        ;
                        *(uint *)(local_640.ray + 0x434) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x434)
                        ;
                        *(uint *)(local_640.ray + 0x438) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x438)
                        ;
                        *(uint *)(local_640.ray + 0x43c) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x43c)
                        ;
                        auVar122 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x140));
                        auVar122 = vmovdqu32_avx512f(auVar122);
                        *(undefined1 (*) [64])(local_640.ray + 0x440) = auVar122;
                        auVar122 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x180));
                        auVar122 = vmovdqu32_avx512f(auVar122);
                        *(undefined1 (*) [64])(local_640.ray + 0x480) = auVar122;
                        auVar267 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x1c0));
                        auVar122 = vmovdqa32_avx512f(auVar267);
                        *(undefined1 (*) [64])(local_640.ray + 0x4c0) = auVar122;
                        auVar122 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x200));
                        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
                        auVar34._4_56_ = auVar122._8_56_;
                        auVar34._0_4_ =
                             (uint)bVar62 * auVar122._4_4_ | (uint)!bVar62 * auVar267._4_4_;
                        auVar123._0_8_ = auVar34._0_8_ << 0x20;
                        bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
                        auVar123._8_4_ =
                             (uint)bVar62 * auVar122._8_4_ | (uint)!bVar62 * auVar267._8_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
                        auVar123._12_4_ =
                             (uint)bVar62 * auVar122._12_4_ | (uint)!bVar62 * auVar267._12_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
                        auVar123._16_4_ =
                             (uint)bVar62 * auVar122._16_4_ | (uint)!bVar62 * auVar267._16_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
                        auVar123._20_4_ =
                             (uint)bVar62 * auVar122._20_4_ | (uint)!bVar62 * auVar267._20_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
                        auVar123._24_4_ =
                             (uint)bVar62 * auVar122._24_4_ | (uint)!bVar62 * auVar267._24_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 7) & 1);
                        auVar123._28_4_ =
                             (uint)bVar62 * auVar122._28_4_ | (uint)!bVar62 * auVar267._28_4_;
                        auVar123._32_4_ =
                             (uint)(bVar14 & 1) * auVar122._32_4_ |
                             (uint)!(bool)(bVar14 & 1) * auVar267._32_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 9) & 1);
                        auVar123._36_4_ =
                             (uint)bVar62 * auVar122._36_4_ | (uint)!bVar62 * auVar267._36_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 10) & 1);
                        auVar123._40_4_ =
                             (uint)bVar62 * auVar122._40_4_ | (uint)!bVar62 * auVar267._40_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 0xb) & 1);
                        auVar123._44_4_ =
                             (uint)bVar62 * auVar122._44_4_ | (uint)!bVar62 * auVar267._44_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 0xc) & 1);
                        auVar123._48_4_ =
                             (uint)bVar62 * auVar122._48_4_ | (uint)!bVar62 * auVar267._48_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 0xd) & 1);
                        auVar123._52_4_ =
                             (uint)bVar62 * auVar122._52_4_ | (uint)!bVar62 * auVar267._52_4_;
                        bVar62 = (bool)((byte)(uVar58 >> 0xe) & 1);
                        auVar123._56_4_ =
                             (uint)bVar62 * auVar122._56_4_ | (uint)!bVar62 * auVar267._56_4_;
                        bVar62 = SUB81(uVar58 >> 0xf,0);
                        auVar123._60_4_ =
                             (uint)bVar62 * auVar122._60_4_ | (uint)!bVar62 * auVar267._60_4_;
                        auVar112._16_48_ = auVar123._16_48_;
                        auVar122 = vmovdqa32_avx512f(auVar122);
                        *(undefined1 (*) [64])(local_640.ray + 0x500) = auVar122;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar241;
                    break;
                  }
                  lVar54 = lVar54 + -1;
                } while (lVar54 != 0);
              }
            }
          }
          auVar267 = ZEXT1664(local_600);
          auVar268 = ZEXT1664(local_610);
          if ((uint)uVar52 == 0) break;
        } while( true );
      }
      uVar133 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar27._4_4_ = uVar133;
      auVar27._0_4_ = uVar133;
      auVar27._8_4_ = uVar133;
      auVar27._12_4_ = uVar133;
      auVar27._16_4_ = uVar133;
      auVar27._20_4_ = uVar133;
      auVar27._24_4_ = uVar133;
      auVar27._28_4_ = uVar133;
      uVar22 = vcmpps_avx512vl(local_3c0,auVar27,2);
      uVar59 = (uint)uVar57 & (uint)uVar22;
      uVar57 = (ulong)uVar59;
    } while (uVar59 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }